

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::RALocalAllocator::makeInitialAssignment(RALocalAllocator *this)

{
  RAAssignment *this_00;
  uint **ppuVar1;
  byte bVar2;
  BaseNode BVar3;
  BaseNode BVar4;
  InstNode IVar5;
  char *pcVar6;
  long lVar7;
  BaseNode *pBVar8;
  WorkToPhysMap *__src;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  undefined1 *puVar11;
  ZoneAllocator *pZVar12;
  undefined4 workId;
  RegGroup RVar13;
  Error EVar14;
  int iVar15;
  uint uVar16;
  Error extraout_EAX;
  uint32_t uVar17;
  long lVar18;
  ulong uVar19;
  RAStackSlot *pRVar20;
  PhysToWorkMap *pPVar21;
  BaseRAPass *pBVar22;
  RABlock *pRVar23;
  BaseNode *pBVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  BaseRAPass *pBVar30;
  BaseRAPass *pBVar31;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long *extraout_RDX;
  uint *puVar32;
  ulong uVar33;
  BaseRAPass *extraout_RDX_00;
  BaseRAPass *extraout_RDX_01;
  BaseRAPass *extraout_RDX_02;
  BaseRAPass *extraout_RDX_03;
  BaseRAPass *extraout_RDX_04;
  BaseRAPass *extraout_RDX_05;
  BaseRAPass *extraout_RDX_06;
  BaseRAPass *extraout_RDX_07;
  BaseRAPass *pBVar34;
  RABlock *block;
  uint uVar35;
  ulong unaff_RBX;
  BaseRAPass *pBVar36;
  BaseRAPass *pBVar37;
  ulong unaff_RBP;
  void *in_RSI;
  BaseRAPass *pBVar38;
  InstNode *pIVar39;
  BaseRAPass *pBVar40;
  BaseRAPass *pBVar41;
  BaseRAPass *pBVar42;
  BaseRAPass *pBVar43;
  BaseCompiler *pBVar44;
  BaseRAPass *pBVar45;
  uint uVar46;
  BaseRAPass *pBVar47;
  BaseRAPass *pBVar48;
  uint uVar49;
  uint *puVar50;
  _func_int **pp_Var51;
  long lVar52;
  BaseRAPass *unaff_R12;
  BaseRAPass *unaff_R13;
  BaseRAPass *pBVar53;
  InstNode *pIVar54;
  ulong unaff_R14;
  BaseRAPass *pBVar55;
  BaseRAPass *pBVar56;
  WorkToPhysMap *unaff_R15;
  WorkToPhysMap *__s;
  BaseRAPass *pBVar57;
  BaseRAPass *pBVar58;
  bool bVar59;
  char cVar60;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined8 uStack_570;
  undefined8 uStack_568;
  long lStack_558;
  BaseRAPass *pBStack_550;
  InstNode *pIStack_548;
  BaseRAPass *pBStack_540;
  long lStack_538;
  BaseRAPass *pBStack_530;
  ulong uStack_520;
  BaseRAPass *pBStack_518;
  InstNode *pIStack_510;
  BaseRAPass *pBStack_508;
  BaseRAPass *pBStack_500;
  BaseRAPass *pBStack_4f8;
  BaseRAPass *pBStack_4f0;
  BaseRAPass *pBStack_4e8;
  BaseRAPass *pBStack_4e0;
  BaseRAPass *pBStack_4d8;
  BaseRAPass *pBStack_4d0;
  BaseRAPass *pBStack_4c8;
  BaseRAPass *pBStack_4c0;
  BaseRAPass *pBStack_4b8;
  BaseRAPass *pBStack_4b0;
  BaseRAPass *pBStack_4a8;
  code *pcStack_4a0;
  BaseRAPass *pBStack_498;
  BaseRAPass *pBStack_490;
  uint uStack_488;
  uint uStack_484;
  BaseRAPass *pBStack_480;
  char cStack_475;
  uint uStack_474;
  BaseRAPass *pBStack_470;
  BaseRAPass *pBStack_468;
  BaseRAPass *pBStack_460;
  uint uStack_454;
  BaseRAPass *pBStack_450;
  BaseRAPass *pBStack_448;
  BaseRAPass *pBStack_440;
  _func_int **pp_Stack_438;
  BaseRAPass *pBStack_430;
  uint uStack_424;
  BaseRAPass *pBStack_420;
  InstNode *pIStack_418;
  ulong uStack_410;
  BaseRAPass *pBStack_408;
  ulong uStack_400;
  undefined1 auStack_3f8 [64];
  long alStack_3b8 [32];
  undefined8 auStack_2b8 [33];
  BaseRAPass *pBStack_1b0;
  BaseRAPass *pBStack_1a8;
  BaseRAPass *pBStack_1a0;
  ulong uStack_198;
  RAAssignment *pRStack_190;
  BaseRAPass *pBStack_188;
  BaseRAPass *pBStack_180;
  BaseRAPass *pBStack_178;
  ulong uStack_170;
  WorkToPhysMap *pWStack_168;
  code *pcStack_160;
  BaseRAPass *pBStack_158;
  uint uStack_14c;
  BaseRAPass *pBStack_148;
  char cStack_13c;
  RAAssignment *pRStack_138;
  uint *puStack_130;
  BaseRAPass *pBStack_128;
  long *plStack_120;
  BaseRAPass *pBStack_118;
  uint uStack_110;
  char cStack_10c;
  uint *puStack_108;
  ulong uStack_100;
  ArchTraits **ppAStack_f8;
  WorkToPhysMap *pWStack_f0;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 aStack_e8;
  uint uStack_e4;
  int iStack_e0;
  uint uStack_dc;
  RAWorkRegs *pRStack_d8;
  WorkToPhysMap *pWStack_d0;
  BaseRAPass *pBStack_c8;
  uint *apuStack_c0 [4];
  BaseRAPass *pBStack_a0;
  BaseRAPass *pBStack_98;
  BaseRAPass *pBStack_90;
  ulong uStack_88;
  WorkToPhysMap *pWStack_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong local_68;
  long local_60;
  RALocalAllocator *local_58;
  ulong local_50;
  BaseRAPass *local_48;
  ulong local_40;
  BaseRAPass *local_38;
  
  pBVar36 = this->_pass;
  if (*(int *)&pBVar36->field_0xb8 != 0) {
    unaff_R12 = *(BaseRAPass **)((pBVar36->_formatOptions)._padding._data + 4);
    lVar18 = **(long **)&pBVar36->_blocks;
    local_40 = (ulong)*(byte *)&unaff_R12->_extraBlock;
    local_48 = (BaseRAPass *)&this->_curAssignment;
    local_50 = 0;
    uVar46 = 1;
    local_60 = lVar18;
    local_58 = this;
    do {
      if (local_40 != 0) {
        local_38 = (BaseRAPass *)0x0;
        unaff_RBP = 0;
        do {
          unaff_R14 = 4;
          unaff_R13 = local_38;
          do {
            if (*(byte *)&unaff_R12->_extraBlock <= (byte)unaff_RBP) {
              uStack_70 = 0x121b57;
              makeInitialAssignment();
LAB_00121b57:
              uStack_70 = 0x121b5c;
              makeInitialAssignment();
LAB_00121b5c:
              uStack_70 = 0x121b61;
              makeInitialAssignment();
LAB_00121b61:
              uStack_70 = 0x121b66;
              makeInitialAssignment();
LAB_00121b66:
              uStack_70 = 0x121b6b;
              makeInitialAssignment();
LAB_00121b6b:
              uStack_70 = 0x121b70;
              makeInitialAssignment();
              goto LAB_00121b70;
            }
            unaff_RBX = (ulong)uVar46;
            uVar28 = uVar46;
            if (*(int *)(*(long *)(&unaff_R12->field_0x300 + 0x48) + (long)unaff_R13 * 2) != 0) {
              uVar26 = *(int *)(*(long *)(&unaff_R12->field_0x300 + 0x48) + 4 + (long)unaff_R13 * 2)
                       - 0x100;
              if ((uVar26 < *(uint *)&this->_cc->field_0x1f0) &&
                 (unaff_R15 = *(WorkToPhysMap **)
                               (*(long *)(*(long *)&this->_cc->_vRegArray + (ulong)uVar26 * 8) +
                               0x28), unaff_R15 != (WorkToPhysMap *)0x0)) {
                uVar26 = *(uint *)unaff_R15;
                if (*(uint *)(lVar18 + 0x80) <= uVar26) goto LAB_00121b57;
                if ((*(ulong *)(*(long *)(lVar18 + 0x78) + (ulong)(uVar26 >> 6) * 8) >>
                     ((ulong)uVar26 & 0x3f) & 1) != 0) {
                  if ((this->_curAssignment)._layout.workCount <= uVar26) goto LAB_00121b5c;
                  if ((this->_curAssignment)._workToPhysMap[uVar26].physIds[0] == 0xff) {
                    RVar13 = unaff_R15[0x21].physIds[0] & kMaxValue;
                    if (kExtraVirt3 < RVar13) goto LAB_00121b61;
                    in_RSI = (void *)(ulong)RVar13;
                    uVar27 = ~*(uint *)((long)(((this->_curAssignment)._physToWorkMap)->assigned).
                                              _masks._data + (ulong)((uint)RVar13 * 4)) &
                             *(uint *)((long)(this->_availableRegs)._masks._data +
                                      (ulong)((uint)RVar13 * 4));
                    if ((int)local_50 == 0) {
                      bVar25 = unaff_R15[0x4a].physIds[0];
                      local_68 = (ulong)bVar25;
                      uVar28 = 2;
                      if ((bVar25 != 0xff) && ((uVar27 >> (bVar25 & 0x1f) & 1) != 0)) {
                        uStack_70 = 0x121a49;
                        pBVar36 = local_48;
                        RAAssignment::assign
                                  ((RAAssignment *)local_48,RVar13,uVar26,(uint)bVar25,true);
                        if (0x1f < unaff_RBP) goto LAB_00121b6b;
LAB_00121a53:
                        pBVar36 = local_58->_pass;
                        *(uint *)(&pBVar36->field_0x22c + (long)unaff_R13) =
                             (uint)*(byte *)(*(long *)(unaff_R15 + 8) + 0xd) +
                             ((int)local_68 << 0x10 | (*(uint *)(unaff_R15 + 0x20) & 0xf8) << 0x15)
                             + 0x100;
                        this = local_58;
                        lVar18 = local_60;
                        uVar28 = uVar46;
                      }
                    }
                    else {
                      if (uVar27 != 0) {
                        uVar28 = 0;
                        if (uVar27 != 0) {
                          for (; (uVar27 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        local_68 = (ulong)uVar28;
                        uStack_70 = 0x121a05;
                        pBVar36 = local_48;
                        RAAssignment::assign((RAAssignment *)local_48,RVar13,uVar26,uVar28,true);
                        if (unaff_RBP < 0x20) goto LAB_00121a53;
                        goto LAB_00121b66;
                      }
                      if (*(long *)(unaff_R15 + 0x18) == 0) {
                        uVar46 = (pBVar36->_sp).super_Operand.super_Operand_._baseId;
                        in_RSI = (void *)(ulong)uVar46;
                        local_68 = CONCAT44(local_68._4_4_,1);
                        uStack_70 = 0x121ad1;
                        pRVar20 = RAStackAllocator::newSlot
                                            (&pBVar36->_stackAllocator,uVar46,
                                             *(uint32_t *)(*(long *)(unaff_R15 + 8) + 8),
                                             (uint)*(byte *)(*(long *)(unaff_R15 + 8) + 0xc),1);
                        *(RAStackSlot **)(unaff_R15 + 0x18) = pRVar20;
                        uVar46 = *(uint *)(unaff_R15 + 0x24) | 0x100;
                        *(uint *)(unaff_R15 + 0x24) = uVar46;
                        if (pRVar20 == (RAStackSlot *)0x0) goto LAB_00121b40;
                        pBVar36 = local_58->_pass;
                        this = local_58;
                        lVar18 = local_60;
                      }
                      else {
                        uVar46 = *(uint *)(unaff_R15 + 0x24);
                      }
                      *(uint *)(unaff_R15 + 0x24) = uVar46 | 0x400;
                      pBVar36->_numStackArgsToStackSlots = pBVar36->_numStackArgsToStackSlots + 1;
                    }
                  }
                }
              }
            }
            uVar46 = uVar28;
            unaff_R13 = (BaseRAPass *)((long)&(unaff_R13->super_FuncPass).super_Pass._vptr_Pass + 4)
            ;
            unaff_R14 = unaff_R14 - 1;
          } while (unaff_R14 != 0);
          unaff_RBP = unaff_RBP + 1;
          local_38 = (BaseRAPass *)&(local_38->super_FuncPass).super_Pass._name;
        } while (unaff_RBP != local_40);
      }
      uVar28 = (int)local_50 + 1;
      local_50 = (ulong)uVar28;
      if (uVar46 <= uVar28) {
        local_68 = 0;
LAB_00121b40:
        return (Error)local_68;
      }
    } while( true );
  }
LAB_00121b70:
  uStack_70 = 0x121b75;
  makeInitialAssignment();
  uStack_78 = 0x121b8e;
  uStack_70 = unaff_RBX;
  memcpy(*(void **)&pBVar36->field_0x68,in_RSI,(ulong)*(uint *)&pBVar36->field_0x50 * 4 + 0x20);
  uStack_78 = 0x121b9f;
  memset(*(void **)&pBVar36->field_0x60,0xff,(ulong)*(uint *)&pBVar36->field_0x54);
  lVar18 = 0;
  _cStack_10c = 0xffffffff;
  while (uVar46 = *(uint *)(*(long *)&pBVar36->field_0x68 + lVar18 * 4), uVar46 == 0) {
LAB_00121bdf:
    lVar18 = lVar18 + 1;
    if (lVar18 == 4) {
      return 0;
    }
  }
  bVar25 = *(byte *)((long)(&pBVar36->_formatOptions + -6) + lVar18 + 8);
  pBVar34 = (BaseRAPass *)(ulong)bVar25;
  while( true ) {
    uVar28 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
      }
    }
    pBVar37 = (BaseRAPass *)(ulong)uVar28;
    pBVar48 = (BaseRAPass *)(ulong)(uVar28 + bVar25);
    pBVar45 = (BaseRAPass *)
              (ulong)*(uint *)(*(long *)&pBVar36->field_0x68 + 0x20 + (long)pBVar48 * 4);
    if (pBVar45 == (BaseRAPass *)0xffffffff) break;
    *(char *)((long)&(pBVar45->super_FuncPass).super_Pass._vptr_Pass + *(long *)&pBVar36->field_0x60
             ) = (char)uVar28;
    uVar46 = uVar46 - 1 & uVar46;
    if (uVar46 == 0) goto LAB_00121bdf;
  }
  uStack_78 = 0x121bf1;
  replaceAssignment();
  _cStack_13c = SUB84(pBVar45,0);
  apuStack_c0[2] = (uint *)0x0;
  apuStack_c0[3] = (uint *)0x0;
  apuStack_c0[0] = (uint *)0x0;
  apuStack_c0[1] = (uint *)0x0;
  pBVar47 = (BaseRAPass *)(pBVar37->super_FuncPass).super_Pass._vptr_Pass;
  bVar25 = (pBVar47->_physRegCount).field_0._regs[0];
  uVar46 = (uint)(pBVar47->_physRegCount).field_0._regs[1] + (uint)bVar25;
  pBVar38 = pBVar34;
  __s = unaff_R15;
  pBStack_a0 = pBVar36;
  pBStack_98 = unaff_R12;
  pBStack_90 = unaff_R13;
  uStack_88 = unaff_R14;
  pWStack_80 = unaff_R15;
  uStack_78 = unaff_RBP;
  if (0xff < uVar46) goto LAB_00122384;
  uVar28 = (pBVar47->_physRegCount).field_0._regs[2] + uVar46;
  pBStack_178 = pBVar34;
  if (0xff < uVar28) goto LAB_00122389;
  pRStack_138 = (RAAssignment *)&pBVar37->field_0x48;
  pRStack_d8 = &pBVar47->_workRegs;
  aStack_e8._packed = uVar28 * 0x1000000 | uVar46 * 0x10000 | (uint)bVar25 << 8;
  uStack_e4 = (pBVar47->_physRegCount).field_0._packed;
  iStack_e0 = (uStack_e4 >> 0x18) + uVar28;
  uStack_dc = *(uint *)&pBVar47->field_0x148;
  uVar33 = (ulong)uStack_dc;
  __s = (WorkToPhysMap *)pBVar37->_lastTimestamp;
  lVar18 = 0;
  do {
    *(uint **)((long)apuStack_c0 + lVar18) =
         (((RARegMask *)&pBVar34->_allocator)->_masks)._data +
         (ulong)(aStack_e8._packed >> ((byte)lVar18 & 0x1f) & 0xff) + 2;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x20);
  pBVar38 = (BaseRAPass *)0xff;
  pcStack_160 = (code *)0x121cf2;
  pBStack_158 = pBVar37;
  plStack_120 = extraout_RDX;
  pWStack_d0 = __s;
  pBStack_c8 = pBVar34;
  memset(__s,0xff,uVar33);
  lVar18 = 0;
  do {
    uVar46 = (((RARegMask *)&pBVar34->_allocator)->_masks)._data[lVar18 + -6];
    if (uVar46 != 0) {
      bVar25 = aStack_e8._regs[lVar18];
      pBVar38 = (BaseRAPass *)(ulong)bVar25;
      while( true ) {
        iVar15 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
          }
        }
        uVar19 = (ulong)(((RARegMask *)&pBVar34->_allocator)->_masks)._data
                        [(ulong)(iVar15 + (uint)bVar25) + 2];
        if (uVar19 == 0xffffffff) break;
        __s[uVar19].physIds[0] = (uint8_t)iVar15;
        uVar46 = uVar46 - 1 & uVar46;
        if (uVar46 == 0) goto LAB_00121d2a;
      }
      pcStack_160 = (code *)0x122331;
      switchToAssignment();
LAB_00122331:
      pcStack_160 = (code *)0x122336;
      switchToAssignment();
LAB_00122336:
      pcStack_160 = (code *)0x12233b;
      switchToAssignment();
LAB_0012233b:
      pcStack_160 = (code *)0x122340;
      switchToAssignment();
LAB_00122340:
      pcStack_160 = (code *)0x122345;
      switchToAssignment();
LAB_00122345:
      pcStack_160 = (code *)0x12234a;
      switchToAssignment();
LAB_0012234a:
      pcStack_160 = (code *)0x12234f;
      switchToAssignment();
LAB_0012234f:
      pcStack_160 = (code *)0x122354;
      switchToAssignment();
LAB_00122354:
      pcStack_160 = (code *)0x122359;
      switchToAssignment();
LAB_00122359:
      pcStack_160 = (code *)0x12235e;
      switchToAssignment();
LAB_0012235e:
      pcStack_160 = (code *)0x122363;
      switchToAssignment();
      return 3;
    }
LAB_00121d2a:
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  ppAStack_f8 = (ArchTraits **)&(pBVar34->super_FuncPass).super_Pass._name;
  pBVar47 = (BaseRAPass *)0x0;
  pBStack_128 = pBVar34;
  uStack_100 = uVar33;
  pWStack_f0 = __s;
  pBVar45 = pBStack_158;
  do {
    unaff_RBP = uStack_100;
    unaff_R12 = pBStack_128;
    pBStack_148 = pBVar47;
    if ((cStack_13c == '\0') &&
       (uVar46 = (((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap->assigned)._masks._data
                 [(long)pBVar47], pBVar48 = pBVar47, uVar46 != 0)) {
      while( true ) {
        pBVar36 = (BaseRAPass *)(ulong)uVar46;
        pBVar37 = (BaseRAPass *)0xffffffff;
        uVar28 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        __s = (WorkToPhysMap *)(ulong)uVar28;
        uVar26 = (((RAAssignment *)&pBVar45->field_0x48)->_physToWorkIds)._data[(long)pBVar48]
                 [(long)__s];
        unaff_R13 = (BaseRAPass *)(ulong)uVar26;
        if (unaff_R13 == (BaseRAPass *)0xffffffff) goto LAB_00122359;
        if (*(uint *)(plStack_120 + 1) <= uVar26) goto LAB_0012235e;
        if ((*(ulong *)(*plStack_120 + (ulong)(uVar26 >> 6) * 8) >> ((ulong)unaff_R13 & 0x3f) & 1)
            != 0) break;
LAB_00121df3:
        pBVar38 = (BaseRAPass *)((ulong)pBVar48 & 0xff);
        pcStack_160 = (code *)0x121e07;
        RAAssignment::unassign(pRStack_138,(RegGroup)pBVar48,uVar26,uVar28);
        pBVar45 = pBStack_158;
        pBVar47 = pBStack_148;
LAB_00121e15:
        uVar46 = uVar46 - 1 & uVar46;
        pBVar48 = pBVar47;
        if (uVar46 == 0) goto LAB_00121e22;
      }
      if (uVar26 < (uint)unaff_RBP) {
        pBVar47 = pBVar48;
        if (pWStack_f0[(long)unaff_R13].physIds[0] == 0xff) {
          if (((((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap->dirty)._masks._data
               [(long)pBVar48] >> (uVar28 & 0x1f) & 1) != 0) {
            pcStack_160 = (code *)0x121de6;
            EVar14 = onSaveReg((RALocalAllocator *)pBVar45,(RegGroup)pBVar48,uVar26,uVar28);
            pBVar48 = pBStack_148;
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          goto LAB_00121df3;
        }
        goto LAB_00121e15;
      }
      pcStack_160 = (code *)0x122370;
      switchToAssignment();
LAB_00122370:
      pcStack_160 = (code *)0x122375;
      switchToAssignment();
LAB_00122375:
      pcStack_160 = (code *)0x12237a;
      switchToAssignment();
LAB_0012237a:
      pcStack_160 = (code *)0x12237f;
      switchToAssignment();
      break;
    }
LAB_00121e22:
    uVar46 = (((RARegMask *)&unaff_R12->_allocator)->_masks)._data
             [(long)(&pBVar47[-1].field_0x3b0 + 0xfa)];
    pBVar48 = pBVar47;
    if (uVar46 != 0) {
      puVar50 = (uint *)((long)ppAStack_f8 + (long)pBVar47 * 4);
      iVar15 = -1;
      puStack_130 = puVar50;
      pBVar38 = (BaseRAPass *)0x0;
      do {
        iVar15 = iVar15 + 1;
        if (iVar15 == 2) {
          if (cStack_13c == '\0') {
            return 3;
          }
          break;
        }
        pBStack_118 = pBVar38;
        puStack_108 = apuStack_c0[(long)pBVar47];
        unaff_R12 = (BaseRAPass *)(ulong)uVar46;
        do {
          uVar28 = 0;
          uVar26 = (uint)unaff_R12;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar35 = 1 << ((byte)uVar28 & 0x1f);
          uVar27 = *(uint *)((long)puStack_108 + (ulong)(uVar28 * 4));
          __s = (WorkToPhysMap *)(ulong)uVar27;
          if (__s == (WorkToPhysMap *)0xffffffff) goto LAB_00122331;
          uVar49 = *(uint *)((long)(((RAAssignment *)&pBVar45->field_0x48)->_physToWorkIds)._data
                                   [(long)pBVar47] + (ulong)(uVar28 * 4));
          unaff_R13 = (BaseRAPass *)(ulong)uVar49;
          if (uVar49 == 0xffffffff) {
LAB_00121ff6:
            if ((((RAAssignment *)&pBVar45->field_0x48)->_layout).workCount <= uVar27)
            goto LAB_00122340;
            bVar25 = __s[(long)((RAAssignment *)&pBVar45->field_0x48)->_workToPhysMap].physIds[0];
            unaff_R14 = (ulong)bVar25;
            if (bVar25 == 0xff) {
              if (*(uint *)(plStack_120 + 1) <= uVar27) goto LAB_0012234f;
              uVar28 = uVar35;
              if ((*(ulong *)(*plStack_120 + (ulong)(uVar27 >> 6) * 8) >> ((ulong)__s & 0x3f) & 1)
                  == 0) {
                uVar28 = 0;
              }
              pBStack_118 = (BaseRAPass *)(ulong)((uint)pBStack_118 | uVar28);
              uVar46 = uVar46 & ~uVar35;
            }
            else {
              if (uVar28 != bVar25) {
                unaff_R13 = (BaseRAPass *)(ulong)uVar46;
                pcStack_160 = (code *)0x122034;
                RAAssignment::reassign(pRStack_138,(RegGroup)pBVar47,uVar27,uVar28,(uint)bVar25);
                pBVar36 = (BaseRAPass *)(pBStack_158->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_160 = (code *)0x122049;
                EVar14 = (*(pBVar36->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar36,(ulong)uVar27,(ulong)uVar28,(ulong)bVar25);
LAB_00122051:
                pBVar45 = pBStack_158;
                pBVar47 = pBStack_148;
                puVar50 = puStack_130;
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
LAB_00122067:
              uVar49 = *puVar50;
              pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
              uVar29 = (pPVar21->dirty)._masks._data[(long)pBVar47];
              if (((uVar29 ^ uVar49) & uVar35) != 0) {
                if ((uVar49 & uVar35) == 0) {
                  if ((uVar29 & uVar35) == 0) goto LAB_00122354;
                  puVar32 = puVar50;
                  if (cStack_10c != '\0') {
                    unaff_R14 = (ulong)uVar46;
                    pcStack_160 = (code *)0x122100;
                    EVar14 = onSaveReg((RALocalAllocator *)pBVar45,(RegGroup)pBVar47,uVar27,uVar28);
                    pBVar45 = pBStack_158;
                    pBVar47 = pBStack_148;
                    puVar50 = puStack_130;
                    if (EVar14 != 0) {
                      return EVar14;
                    }
                    goto LAB_00122123;
                  }
                }
                else {
                  if ((uVar29 & uVar35) != 0) goto LAB_00122345;
                  puVar32 = (pPVar21->dirty)._masks._data + (long)pBVar47;
                  uVar49 = uVar29;
                }
                *puVar32 = uVar49 | uVar35;
              }
LAB_00122123:
              if (*(int *)((long)puStack_108 + (ulong)(uVar28 << 2)) !=
                  *(int *)((long)(((RAAssignment *)&pBVar45->field_0x48)->_physToWorkIds)._data
                                 [(long)pBVar47] + (ulong)(uVar28 << 2))) goto LAB_00122336;
              if (((*puVar50 & uVar35) != 0) !=
                  (((((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap->dirty)._masks._data
                    [(long)pBVar47] & uVar35) != 0)) goto LAB_0012233b;
              uVar46 = uVar46 & ~uVar35;
              iVar15 = -1;
            }
          }
          else {
            if (uVar49 == uVar27) goto LAB_00122067;
            if (0 < iVar15) {
              if ((((RAAssignment *)&pBVar45->field_0x48)->_layout).workCount <= uVar27)
              goto LAB_0012234a;
              bVar25 = ((RAAssignment *)&pBVar45->field_0x48)->_workToPhysMap[(long)__s].physIds[0];
              unaff_R14 = (ulong)bVar25;
              if (bVar25 != 0xff) {
                RVar13 = (RegGroup)pBVar47;
                if (((((ArchTraits *)(pBVar45->super_FuncPass).super_Pass._name)->_instHints)._data
                     [(long)pBVar47] & kRegSwap) == kNoHints) {
                  pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
                  if (((pPVar21->dirty)._masks._data[(long)pBVar47] & uVar35) == 0) {
                    pcStack_160 = (code *)0x121fdb;
                    RAAssignment::unassign(pRStack_138,RVar13,uVar49,uVar28);
                    pBVar45 = pBStack_158;
                    pBVar47 = pBStack_148;
                    puVar50 = puStack_130;
                  }
                  else {
                    uVar16 = ~(pPVar21->assigned)._masks._data[(long)pBVar47] &
                             (((BaseRAPass *)(pBVar45->super_FuncPass).super_Pass._vptr_Pass)->
                             _availableRegs)._masks._data[(long)pBVar47];
                    uVar29 = ~(((RARegMask *)&pBStack_128->_allocator)->_masks)._data
                              [(long)(&pBVar47[-1].field_0x3b0 + 0xfa)] & uVar16;
                    if ((uVar29 == 0) && (uVar29 = uVar16, uVar16 == 0)) {
                      uStack_110 = (uint)pBVar47 & 0xff;
                      pcStack_160 = (code *)0x12218d;
                      uStack_14c = uVar46;
                      EVar14 = onSaveReg((RALocalAllocator *)pBVar45,RVar13,uVar49,uVar28);
                      if (EVar14 != 0) {
                        return EVar14;
                      }
                      pcStack_160 = (code *)0x1221a8;
                      RAAssignment::unassign(pRStack_138,(RegGroup)uStack_110,uVar49,uVar28);
                      iVar15 = -1;
                      pBVar45 = pBStack_158;
                      pBVar47 = pBStack_148;
                      puVar50 = puStack_130;
                      uVar46 = uStack_14c;
                      goto LAB_00121ff6;
                    }
                    uVar16 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    if (uVar16 != uVar28) {
                      pcStack_160 = (code *)0x121f3a;
                      uStack_14c = uVar46;
                      RAAssignment::reassign(pRStack_138,RVar13,uVar49,uVar16,uVar28);
                      pBVar36 = (BaseRAPass *)(pBStack_158->super_FuncPass).super_Pass._vptr_Pass;
                      pcStack_160 = (code *)0x121f4f;
                      EVar14 = (*(pBVar36->super_FuncPass).super_Pass._vptr_Pass[9])
                                         (pBVar36,unaff_R13,(ulong)uVar16,(ulong)uVar28);
                      pBVar45 = pBStack_158;
                      pBVar47 = pBStack_148;
                      puVar50 = puStack_130;
                      uVar46 = uStack_14c;
                      if (EVar14 != 0) {
                        return EVar14;
                      }
                    }
                    puVar32 = (((RARegMask *)&pBVar45->field_0x28)->_masks)._data + (long)pBVar47;
                    *puVar32 = *puVar32 | 1 << ((byte)uVar16 & 0x1f);
                  }
                  iVar15 = -1;
                  goto LAB_00121ff6;
                }
                pcStack_160 = (code *)0x121f9e;
                uStack_14c = uVar46;
                RAAssignment::swap(pRStack_138,RVar13,uVar49,uVar28,uVar27,(uint)bVar25);
                pBVar36 = (BaseRAPass *)(pBStack_158->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_160 = (code *)0x121fb6;
                EVar14 = (*(pBVar36->super_FuncPass).super_Pass._vptr_Pass[10])
                                   (pBVar36,unaff_R13,(ulong)uVar28,__s,unaff_R14);
                uVar46 = uStack_14c;
                goto LAB_00122051;
              }
            }
          }
          uVar26 = uVar26 - 1 & uVar26;
          unaff_R12 = (BaseRAPass *)(ulong)uVar26;
        } while (uVar26 != 0);
        pBVar38 = pBStack_118;
      } while (uVar46 != 0);
      pBVar48 = pBVar47;
      if ((int)pBVar38 != 0) {
        pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
        unaff_RBP = (ulong)pBVar47 & 0xff;
        do {
          pBVar37 = (BaseRAPass *)0xffffffff;
          uVar46 = 0;
          uVar28 = (uint)pBVar38;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          unaff_R14 = (ulong)uVar46;
          uVar26 = 1 << ((byte)uVar46 & 0x1f);
          pBVar36 = (BaseRAPass *)(ulong)uVar26;
          if (((pPVar21->assigned)._masks._data[(long)pBVar48] >> (uVar46 & 0x1f) & 1) != 0) {
            if (cStack_13c != '\0') goto LAB_001222ce;
            goto LAB_00122370;
          }
          uVar27 = apuStack_c0[(long)pBVar48][unaff_R14];
          __s = (WorkToPhysMap *)(ulong)uVar27;
          if (*(uint *)(plStack_120 + 1) <= uVar27) goto LAB_00122375;
          if ((*(ulong *)(*plStack_120 + (ulong)(uVar27 >> 6) * 8) >> ((ulong)__s & 0x3f) & 1) == 0)
          goto LAB_0012237a;
          pcStack_160 = (code *)0x12226d;
          RAAssignment::assign(pRStack_138,(RegGroup)pBVar47,uVar27,uVar46,false);
          pBVar34 = (BaseRAPass *)(pBVar45->super_FuncPass).super_Pass._vptr_Pass;
          pcStack_160 = (code *)0x12227d;
          EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[0xb])
                             (pBVar34,(ulong)uVar27,(ulong)uVar46);
          if (EVar14 != 0) {
            return EVar14;
          }
          pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
          uVar46 = (pPVar21->dirty)._masks._data[(long)pBStack_148];
          unaff_R12 = pBVar45;
          pBVar48 = pBStack_148;
          unaff_R13 = pBVar38;
          if ((*(uint *)((long)(&pBStack_128->_formatOptions + -10) + (long)pBStack_148 * 4) &
              uVar26) == 0) {
            pBVar37 = (BaseRAPass *)0xffffffff;
            if ((uVar46 & uVar26) != 0) goto LAB_0012237f;
          }
          else {
            (pPVar21->dirty)._masks._data[(long)pBStack_148] = uVar46 | uVar26;
            pBVar37 = (BaseRAPass *)0xffffffff;
            if ((*(uint *)((long)(&pBStack_128->_formatOptions + -10) + (long)pBStack_148 * 4) &
                uVar26) == 0) goto LAB_0012237f;
          }
LAB_001222ce:
          uVar28 = uVar28 - 1 & uVar28;
          pBVar38 = (BaseRAPass *)(ulong)uVar28;
        } while (uVar28 != 0);
      }
    }
    pBVar47 = (BaseRAPass *)((long)&(pBVar48->super_FuncPass).super_Pass._vptr_Pass + 1);
    if (pBVar47 == (BaseRAPass *)0x4) {
      EVar14 = 0;
      if (cStack_13c == '\0') {
        pcStack_160 = (code *)0x12230b;
        bVar59 = RAAssignment::equals((RAAssignment *)&aStack_e8,pRStack_138);
        if (!bVar59) {
          pcStack_160 = (code *)0x122314;
          switchToAssignment();
          EVar14 = extraout_EAX;
        }
      }
      return EVar14;
    }
  } while( true );
LAB_0012237f:
  pcStack_160 = (code *)0x122384;
  switchToAssignment();
LAB_00122384:
  uVar28 = (uint)pBVar38;
  pcStack_160 = (code *)0x122389;
  switchToAssignment();
  pBStack_178 = unaff_R12;
LAB_00122389:
  pcStack_160 = spillScratchGpRegsBeforeEntry;
  switchToAssignment();
  if (uVar28 == 0) {
    return 0;
  }
  this_00 = (RAAssignment *)&pBVar37->field_0x48;
  pBVar34 = pBVar37;
  pBStack_180 = pBVar36;
  uStack_170 = unaff_R14;
  pWStack_168 = __s;
  pcStack_160 = (code *)unaff_RBP;
  do {
    uVar46 = 0;
    if (uVar28 != 0) {
      for (; (uVar28 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
      }
    }
    pBVar36 = (BaseRAPass *)(ulong)uVar46;
    pPVar21 = ((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap;
    uVar26 = 1 << ((byte)uVar46 & 0x1f);
    if (((pPVar21->assigned)._masks._data[0] >> (uVar46 & 0x1f) & 1) != 0) {
      pIVar39 = (InstNode *)(ulong)uVar46;
      uVar27 = (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data[0][(long)pIVar39];
      pBVar47 = (BaseRAPass *)(ulong)uVar27;
      uVar35 = (pPVar21->dirty)._masks._data[0];
      if ((uVar35 & uVar26) != 0) {
        if (uVar27 == 0xffffffff) {
          pBStack_188 = (BaseRAPass *)0x12242e;
          spillScratchGpRegsBeforeEntry();
LAB_0012242e:
          pBStack_188 = (BaseRAPass *)0x122433;
          spillScratchGpRegsBeforeEntry();
        }
        else {
          if ((((RAAssignment *)&pBVar37->field_0x48)->_layout).workCount <= uVar27)
          goto LAB_0012242e;
          bVar25 = ((WorkToPhysMap *)
                   ((long)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass +
                   (long)((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap))->physIds[0];
          pIVar39 = (InstNode *)(ulong)bVar25;
          if (uVar46 == bVar25) {
            (pPVar21->dirty)._masks._data[0] = uVar35 & ~uVar26;
            pBVar36 = (BaseRAPass *)(pBVar37->super_FuncPass).super_Pass._vptr_Pass;
            pBStack_188 = (BaseRAPass *)0x1223ff;
            EVar14 = (*(pBVar36->super_FuncPass).super_Pass._vptr_Pass[0xc])
                               (pBVar36,pBVar47,(ulong)uVar46);
            if (EVar14 != 0) {
              return EVar14;
            }
            goto LAB_00122403;
          }
        }
        pBStack_188 = (BaseRAPass *)allocInst;
        spillScratchGpRegsBeforeEntry();
        pBStack_188 = pBVar36;
        pRStack_190 = this_00;
        uStack_198 = (ulong)uVar28;
        pBStack_1a0 = unaff_R13;
        pBStack_1a8 = pBVar47;
        pBStack_1b0 = pBVar37;
        pBVar38 = *(BaseRAPass **)(pIVar39 + 0x20);
        (((BaseCompiler *)(pBVar34->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
             *(BaseNode **)pIVar39;
        *(InstNode **)&pBVar34->_instructionCount = pIVar39;
        *(BaseRAPass **)&pBVar34->_sharedAssignments = pBVar38;
        *(uint32_t *)&pBVar34->field_0xf0 = *(uint32_t *)&(pBVar38->super_FuncPass).super_Pass._name
        ;
        ((RARegCount *)&pBVar34->field_0xf4)->field_0 =
             (anon_union_4_2_ebeb14a8_for_RARegCount_0)
             (((RARegMask *)&pBVar38->_allocator)->_masks)._data[0];
        pBStack_460 = (BaseRAPass *)&pBVar34->field_0x48;
        auStack_3f8._56_8_ = pIVar39 + 0x40;
        pBVar57 = (BaseRAPass *)0x0;
        uStack_400 = 0;
        pBStack_498 = pBVar34;
        pIStack_418 = pIVar39;
        pBStack_408 = pBVar38;
        break;
      }
LAB_00122403:
      pBStack_188 = (BaseRAPass *)0x122412;
      pBVar34 = (BaseRAPass *)this_00;
      RAAssignment::unassign(this_00,k0,uVar27,uVar46);
    }
    uVar28 = uVar28 - 1 & uVar28;
    if (uVar28 == 0) {
      return 0;
    }
  } while( true );
LAB_001224bb:
  bVar25 = (char)pBVar57 * '\b';
  pBVar41 = *(BaseRAPass **)&pBVar34->_sharedAssignments;
  uVar46 = *(uint *)((long)&(pBVar41->super_FuncPass).super_Pass._name + 4) >> (bVar25 & 0x1f);
  pBVar22 = (BaseRAPass *)(ulong)uVar46;
  uStack_484 = (((RARegMask *)&pBVar41->field_0x28)->_masks)._data
               [(long)((long)&(pBVar57->super_FuncPass).super_Pass._vptr_Pass + 1)];
  uStack_454 = (((RARegMask *)&pBVar41->field_0x38)->_masks)._data
               [(long)((long)&(pBVar57->super_FuncPass).super_Pass._vptr_Pass + 1)];
  pBVar31 = (BaseRAPass *)(ulong)uStack_454;
  cStack_475 = '\x01';
  uVar28 = (((RARegCount *)&pBVar34->field_0xf4)->field_0)._packed >> (bVar25 & 0x1f) & 0xff;
  pBVar55 = (BaseRAPass *)(ulong)uVar28;
  pBVar53 = pBVar34;
  pBStack_490 = pBVar57;
  if (uVar28 == 0) {
    pBStack_448 = (BaseRAPass *)0x0;
    uStack_424 = 0;
    pBStack_440 = (BaseRAPass *)0x0;
    uStack_474 = 0;
    pBVar56 = (BaseRAPass *)(ulong)uStack_454;
    cVar60 = cStack_475;
LAB_00123209:
    cStack_475 = cVar60;
    uVar46 = (uint)pBVar56;
    pBVar30 = pBVar31;
    pBVar42 = pBVar41;
    pBVar55 = pBVar56;
    while (uVar46 != 0) {
      uVar28 = 0;
      uVar46 = (uint)pBVar55;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
        }
      }
      pBVar37 = (BaseRAPass *)(ulong)uVar28;
      uVar26 = (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkIds)._data[(long)pBVar57]
               [(long)pBVar37];
      pBVar36 = (BaseRAPass *)(ulong)uVar26;
      if (uVar26 != 0xffffffff) {
        if (((((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->dirty)._masks._data
             [(long)pBVar57] >> (uVar28 & 0x1f) & 1) != 0) {
          pcStack_4a0 = (code *)0x12323d;
          EVar14 = onSaveReg((RALocalAllocator *)pBVar53,(RegGroup)pBVar57,uVar26,uVar28);
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        pBVar42 = (BaseRAPass *)((ulong)pBVar57 & 0xff);
        pcStack_4a0 = (code *)0x123257;
        pBVar30 = pBVar37;
        pBVar22 = pBStack_460;
        RAAssignment::unassign((RAAssignment *)pBStack_460,(RegGroup)pBVar57,uVar26,uVar28);
        pBVar38 = extraout_RDX_01;
      }
      uVar46 = uVar46 - 1 & uVar46;
      pBVar55 = (BaseRAPass *)(ulong)uVar46;
    }
    if (uStack_424 != 0) {
      pBVar55 = (BaseRAPass *)(ulong)uStack_424;
      pBVar34 = (BaseRAPass *)0x0;
      do {
        puVar50 = (uint *)auStack_2b8[(long)pBVar34];
        pBVar47 = (BaseRAPass *)(ulong)puVar50[4];
        if (puVar50[4] != 0) {
          uVar46 = *puVar50;
          pBVar37 = (BaseRAPass *)(ulong)uVar46;
          bVar25 = *(byte *)((long)puVar50 + 0xe);
          pBVar36 = (BaseRAPass *)(ulong)bVar25;
          do {
            uVar28 = 0;
            uVar26 = (uint)pBVar47;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            pBVar38 = (BaseRAPass *)(ulong)uVar28;
            if (uVar28 != bVar25) {
              pBVar22 = *(BaseRAPass **)&pBVar53->super_FuncPass;
              pBVar42 = (BaseRAPass *)(ulong)uVar46;
              pBVar30 = (BaseRAPass *)(ulong)(uint)bVar25;
              pcStack_4a0 = (code *)0x12329e;
              (**(code **)&((BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass)->
                           field_0x48)();
              pBVar38 = extraout_RDX_02;
            }
            uVar26 = uVar26 - 1 & uVar26;
            pBVar47 = (BaseRAPass *)(ulong)uVar26;
          } while (uVar26 != 0);
        }
        pBVar34 = (BaseRAPass *)((long)&(pBVar34->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (pBVar34 != pBVar55);
    }
    if (((pBStack_490 == (BaseRAPass *)0x1) && (pIStack_418[0x10] == (InstNode)0x12)) &&
       (uVar46 = *(uint *)(*(long *)(&pBVar53->field_0x48 + 0x20) + 4) &
                 *(uint *)(pIStack_418 + 0xa8), pBVar55 = (BaseRAPass *)(ulong)uVar46, uVar46 != 0))
    {
      IVar5 = pIStack_418[0x8d];
      pBVar36 = (BaseRAPass *)(ulong)(byte)IVar5;
      while( true ) {
        uVar46 = 0;
        uVar28 = (uint)pBVar55;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
          }
        }
        pBVar37 = (BaseRAPass *)(ulong)uVar46;
        pp_Var51 = (pBVar53->super_FuncPass).super_Pass._vptr_Pass;
        pBVar30 = *(BaseRAPass **)(&pBVar53->field_0x48 + 0x30);
        uVar26 = (((RARegMask *)&pBVar30->_allocator)->_masks)._data
                 [(long)(&pBVar37[-1].field_0x3b0 + 0xfa)];
        pBVar57 = (BaseRAPass *)(ulong)uVar26;
        pBVar43 = pBVar42;
        if (*(uint *)(pp_Var51 + 0x29) <= uVar26) break;
        if ((uint)(byte)IVar5 <
            *(uint *)(*(long *)(*(long *)(pp_Var51[0x28] + (long)pBVar57 * 8) + 8) + 8)) {
          if ((*(uint *)(*(long *)(&pBVar53->field_0x48 + 0x20) + 0x14) >> (uVar46 & 0x1f) & 1) != 0
             ) {
            pcStack_4a0 = (code *)0x12334c;
            EVar14 = onSaveReg((RALocalAllocator *)pBVar53,kVec,uVar26,uVar46);
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          pBVar42 = (BaseRAPass *)0x1;
          pcStack_4a0 = (code *)0x123368;
          pBVar30 = pBVar37;
          pBVar22 = pBStack_460;
          RAAssignment::unassign((RAAssignment *)pBStack_460,kVec,uVar26,uVar46);
          pBVar38 = extraout_RDX_03;
        }
        uVar28 = uVar28 - 1 & uVar28;
        pBVar55 = (BaseRAPass *)(ulong)uVar28;
        if (uVar28 == 0) goto LAB_00123374;
      }
LAB_001236fd:
      pcStack_4a0 = (code *)0x123702;
      allocInst();
LAB_00123702:
      pcStack_4a0 = (code *)0x123707;
      allocInst();
LAB_00123707:
      pcStack_4a0 = (code *)0x12370c;
      allocInst();
      pBVar40 = pBVar43;
      pBVar34 = pBVar53;
LAB_0012370c:
      pcStack_4a0 = (code *)0x123711;
      allocInst();
LAB_00123711:
      pcStack_4a0 = (code *)0x123716;
      allocInst();
LAB_00123716:
      pcStack_4a0 = (code *)0x12371b;
      allocInst();
      pBVar53 = pBVar34;
LAB_0012371b:
      pcStack_4a0 = (code *)0x123720;
      allocInst();
      pBVar43 = pBVar40;
      goto LAB_00123720;
    }
LAB_00123374:
    uStack_454 = uStack_454 | uStack_484;
    if (uStack_474 != 0) {
      pBStack_470 = (BaseRAPass *)
                    CONCAT44(pBStack_470._4_4_,
                             *(undefined4 *)
                              (*(long *)(&pBVar53->field_0x48 + 0x20) + (long)pBStack_490 * 4));
      if (((int)pBStack_440 != 0) &&
         (((ulong)(((FuncPass *)auStack_3f8._16_8_)->super_Pass)._cb & 0x800) != 0)) {
        uVar46 = *(uint *)((long)&(((FuncPass *)auStack_3f8._16_8_)->super_Pass)._name + 4);
        if (uVar46 == 0) {
          return 0x3d;
        }
        pZVar12 = &pBVar53->_allocator;
        pp_Var51 = (pBVar53->super_FuncPass).super_Pass._vptr_Pass;
        pBVar30 = (BaseRAPass *)((ulong)pBStack_440 & 0xffffffff);
        pBVar53 = (BaseRAPass *)(ulong)(uint)((int)pBStack_440 << 3);
        pBVar48 = (BaseRAPass *)0x0;
        pBVar45 = (BaseRAPass *)0xffffffff;
        uVar28 = uVar46;
        do {
          uVar26 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
          if ((uVar46 >> (uVar26 & 0x1f) & 1) != 0) {
            pBVar55 = (BaseRAPass *)(ulong)uVar26;
            pBVar37 = (BaseRAPass *)0xf;
            lVar18 = 0;
            do {
              if ((*(uint *)(pZVar12 + (long)pBStack_490 * 4) >> ((uint)pBVar55 & 0x1f) & 1) == 0) {
                pBVar37 = (BaseRAPass *)0x0;
                break;
              }
              if (*(uint *)(pp_Var51 + 0x29) <= **(uint **)(auStack_3f8 + lVar18 + 0x10)) {
LAB_00123696:
                pcStack_4a0 = (code *)0x12369b;
                allocInst();
                return 0x3d;
              }
              pBVar47 = (BaseRAPass *)
                        (ulong)*(byte *)(*(long *)(pp_Var51[0x28] +
                                                  (ulong)**(uint **)(auStack_3f8 + lVar18 + 0x10) *
                                                  8) + 0x4a);
              pBVar36 = (BaseRAPass *)(ulong)(pBVar55 == pBVar47);
              pBVar37 = (BaseRAPass *)(ulong)((int)pBVar37 + (uint)(pBVar55 == pBVar47));
              lVar18 = lVar18 + 8;
              pBVar55 = (BaseRAPass *)((long)&(pBVar55->super_FuncPass).super_Pass._vptr_Pass + 1);
            } while (pBVar53 != (BaseRAPass *)lVar18);
            if ((uint)pBVar48 < (uint)pBVar37) {
              pBVar45 = (BaseRAPass *)(ulong)uVar26;
              pBVar48 = pBVar37;
            }
          }
          uVar28 = uVar28 - 1 & uVar28;
        } while (uVar28 != 0);
        if ((int)pBVar45 == -1) {
          return 0x3d;
        }
        pBVar38 = (BaseRAPass *)0x0;
        do {
          pBVar42 = (BaseRAPass *)alStack_3b8[(long)&pBVar38[-1].field_0x4aa];
          uVar46 = (int)pBVar45 + (int)pBVar38;
          pBVar22 = (BaseRAPass *)(ulong)uVar46;
          *(char *)((long)&(pBVar42->super_FuncPass).super_Pass._cb + 7) = (char)uVar46;
          pBVar38 = (BaseRAPass *)((long)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass + 1);
        } while (pBVar30 != pBVar38);
      }
      pBVar43 = pBVar42;
      pBVar57 = pBStack_490;
      if (cStack_475 == '\0') {
        pBVar47 = (BaseRAPass *)0x0;
        pBStack_480 = (BaseRAPass *)((ulong)pBStack_480 & 0xffffffff00000000);
        pBVar55 = pBStack_490;
        do {
          pBVar53 = (BaseRAPass *)alStack_3b8[(long)pBVar47];
          uVar46 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb;
          pBVar56 = (BaseRAPass *)(ulong)uVar46;
          pBVar57 = pBVar55;
          if ((uVar46 & 8) != 0) {
            uVar28 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._vptr_Pass;
            pBVar37 = (BaseRAPass *)(ulong)uVar28;
            pBVar31 = pBVar30;
            pBVar41 = pBVar42;
            if (pBVar37 == (BaseRAPass *)0xffffffff) goto LAB_001236df;
            if ((((RAAssignment *)&pBStack_498->field_0x48)->_layout).workCount <= uVar28)
            goto LAB_001236e4;
            bVar25 = ((WorkToPhysMap *)
                     ((long)&(pBVar37->super_FuncPass).super_Pass._vptr_Pass +
                     (long)((RAAssignment *)&pBStack_498->field_0x48)->_workToPhysMap))->physIds[0];
            pBVar31 = (BaseRAPass *)(ulong)bVar25;
            RVar13 = (RegGroup)pBVar55;
            if (bVar25 != 0xff) {
              pBVar42 = (BaseRAPass *)((ulong)pBVar55 & 0xff);
              pcStack_4a0 = (code *)0x123503;
              pBVar22 = pBStack_460;
              RAAssignment::unassign((RAAssignment *)pBStack_460,RVar13,uVar28,(uint)bVar25);
              pBVar38 = extraout_RDX_04;
            }
            pBVar57 = pBStack_498;
            bVar25 = *(undefined1 *)((long)&(pBVar53->super_FuncPass).super_Pass._cb + 7);
            pBVar36 = (BaseRAPass *)(ulong)bVar25;
            pBVar30 = pBVar36;
            if (bVar25 != 0xff) {
LAB_00123549:
              pBVar57 = pBVar55;
              if (0x1f < (uint)pBVar30) goto LAB_001236ee;
              bVar25 = (byte)pBVar30;
              pBVar36 = pBVar30;
LAB_0012355d:
              uVar46 = 1 << (bVar25 & 0x1f);
              pBVar56 = (BaseRAPass *)(ulong)uVar46;
              pBVar31 = pBVar30;
              if (((((RAAssignment *)&pBStack_498->field_0x48)->_physToWorkMap->assigned)._masks.
                   _data[(long)pBVar57] & uVar46) != 0) goto LAB_001236e9;
              uVar26 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb;
              if ((uVar26 >> 0x12 & 1) == 0) {
                pBVar42 = (BaseRAPass *)((ulong)pBVar57 & 0xff);
                pBVar45 = (BaseRAPass *)0x1;
                pcStack_4a0 = (code *)0x123591;
                pBVar30 = pBVar36;
                pBVar22 = pBStack_460;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_460,(RegGroup)pBVar57,uVar28,(uint32_t)pBVar36,
                           true);
                uVar26 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb;
                pBVar38 = extraout_RDX_06;
              }
              *(char *)((long)&(pBVar53->super_FuncPass).super_Pass._cb + 7) = (char)pBVar36;
              *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb = uVar26 | 0x200;
              pBStack_480 = (BaseRAPass *)CONCAT44(pBStack_480._4_4_,(uint)pBStack_480 | uVar46);
              pBVar56 = (BaseRAPass *)(ulong)~uVar46;
              pBStack_470 = (BaseRAPass *)CONCAT44(pBStack_470._4_4_,(uint)pBStack_470 & ~uVar46);
              uStack_474 = uStack_474 - 1;
              goto LAB_001235b8;
            }
            uVar46 = ~((int)(short)uVar46 >> 0xf & uStack_484 | (uint)pBStack_480) &
                     *(uint *)((long)&(pBVar53->super_FuncPass).super_Pass._name + 4);
            pBVar31 = (BaseRAPass *)(ulong)uVar46;
            uVar26 = ~(uint)pBStack_470 & uVar46;
            pBVar45 = (BaseRAPass *)(ulong)uVar26;
            pBVar22 = pBStack_498;
            if (uVar26 != 0) {
              pBVar42 = (BaseRAPass *)((ulong)pBVar55 & 0xff);
              pcStack_4a0 = (code *)0x123547;
              uVar17 = decideOnAssignment((RALocalAllocator *)pBStack_498,RVar13,uVar28,uVar46,
                                          uVar26);
              pBVar30 = (BaseRAPass *)(ulong)uVar17;
              pBVar38 = extraout_RDX_05;
              goto LAB_00123549;
            }
            pBVar30 = (BaseRAPass *)(ulong)(uVar46 & (uint)pBStack_470);
            pBVar40 = (BaseRAPass *)((ulong)pBVar55 & 0xff);
            uStack_488 = (uint)pBVar40;
            pBVar45 = (BaseRAPass *)auStack_3f8;
            pcStack_4a0 = (code *)0x1235ec;
            uVar17 = decideOnSpillFor((RALocalAllocator *)pBStack_498,RVar13,(uint32_t)pBVar38,
                                      uVar46 & (uint)pBStack_470,(uint32_t *)pBVar45);
            workId = auStack_3f8._0_4_;
            if (uVar17 < 0x20) {
              pBVar36 = (BaseRAPass *)(ulong)uVar17;
              bVar25 = (byte)uVar17;
              if ((*(uint *)(*(long *)(&pBVar57->field_0x48 + 0x20) + 0x10 + (long)pBVar55 * 4) >>
                   (uVar17 & 0x1f) & 1) != 0) {
                pcStack_4a0 = (code *)0x12362c;
                EVar14 = onSaveReg((RALocalAllocator *)pBVar57,(RegGroup)uStack_488,
                                   auStack_3f8._0_4_,uVar17);
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
              pBVar42 = (BaseRAPass *)(ulong)uStack_488;
              pBVar30 = (BaseRAPass *)(ulong)uVar17;
              pcStack_4a0 = (code *)0x123643;
              pBVar22 = pBStack_460;
              RAAssignment::unassign((RAAssignment *)pBStack_460,(RegGroup)uStack_488,workId,uVar17)
              ;
              pBVar38 = extraout_RDX_07;
              pBVar57 = pBStack_490;
              goto LAB_0012355d;
            }
            goto LAB_0012371b;
          }
LAB_001235b8:
          pBVar47 = (BaseRAPass *)((long)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass + 1);
          pBVar55 = pBVar57;
        } while (pBStack_448 != pBVar47);
        pBVar43 = pBVar42;
        pBVar53 = pBStack_498;
        pBVar55 = pBVar56;
        if (uStack_474 == 0) {
          uStack_454 = uStack_454 | (uint)pBStack_480;
          pBStack_490 = pBVar57;
          goto LAB_00123674;
        }
      }
      goto LAB_00123725;
    }
LAB_00123674:
    puVar50 = (((RARegMask *)&pBVar53->field_0x28)->_masks)._data + (long)pBStack_490;
    *puVar50 = *puVar50 | uStack_454;
    pBVar57 = (BaseRAPass *)((long)&(pBStack_490->super_FuncPass).super_Pass._vptr_Pass + 1);
    pBVar34 = pBVar53;
    if (pBVar57 == (BaseRAPass *)0x4) {
      return 0;
    }
    goto LAB_001224bb;
  }
  uVar46 = uVar46 & 0xff;
  uStack_410 = (ulong)uVar46;
  pBVar43 = (BaseRAPass *)
            ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
            ((ulong)(uVar46 << 5) - 0x24));
  pBStack_448 = (BaseRAPass *)(ulong)uVar28;
  pBStack_480 = (BaseRAPass *)0x0;
  uStack_474 = 0;
  uVar26 = 0;
  pBVar30 = pBVar31;
  pBVar40 = pBStack_448;
  pBVar42 = pBVar43;
  uVar33 = 0;
  do {
    uVar27 = *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb;
    pBVar45 = (BaseRAPass *)(ulong)uVar27;
    if ((uVar27 & 0x1c00) != 0) {
      uVar35 = uVar27 >> 0xd & 3;
      if ((uVar27 >> 0xc & 1) != 0) {
        uVar35 = 0;
      }
      pBVar30 = (BaseRAPass *)(ulong)uVar35;
      if ((uVar26 >> uVar35 & 1) != 0) {
        return 3;
      }
      uVar26 = uVar26 | 1 << (sbyte)uVar35;
      alStack_3b8[(ulong)uVar35 - 6] = (long)pBVar42;
    }
    pBVar31 = (BaseRAPass *)auStack_3f8._16_8_;
    if ((uVar27 & 0x40008) != 0) {
      uVar19 = (ulong)uStack_474;
      uStack_474 = uStack_474 + 1;
      pBVar30 = (BaseRAPass *)(ulong)uStack_474;
      alStack_3b8[uVar19] = (long)pBVar42;
    }
    uVar19 = uVar33;
    if ((uVar27 >> 0x10 & 1) != 0) {
      uVar19 = (ulong)((int)uVar33 + 1);
      auStack_2b8[uVar33] = pBVar42;
    }
    uStack_488 = uVar28;
    pBStack_470 = pBVar43;
    pBStack_420 = pBVar41;
    if ((uVar27 & 4) != 0) {
      if ((uVar27 >> 10 & 1) != 0) goto LAB_001226a6;
      uVar35 = *(uint *)&(pBVar42->super_FuncPass).super_Pass._vptr_Pass;
      pBVar30 = (BaseRAPass *)0xffffffff;
      if ((ulong)uVar35 == 0xffffffff) {
LAB_001236cb:
        pcStack_4a0 = (code *)0x1236d0;
        allocInst();
        pBVar22 = pBVar42;
        pBVar53 = pBVar34;
        pBVar56 = pBVar55;
LAB_001236d0:
        pBVar55 = pBVar57;
        pBVar41 = pBVar40;
        pBVar31 = pBVar30;
        pcStack_4a0 = (code *)0x1236d5;
        allocInst();
LAB_001236d5:
        pcStack_4a0 = (code *)0x1236da;
        allocInst();
LAB_001236da:
        pcStack_4a0 = (code *)0x1236df;
        allocInst();
LAB_001236df:
        pcStack_4a0 = (code *)0x1236e4;
        allocInst();
        pBVar42 = pBVar41;
        pBVar57 = pBVar55;
LAB_001236e4:
        pcStack_4a0 = (code *)0x1236e9;
        allocInst();
LAB_001236e9:
        pBVar30 = pBVar36;
        pcStack_4a0 = (code *)0x1236ee;
        allocInst();
LAB_001236ee:
        pcStack_4a0 = (code *)0x1236f3;
        allocInst();
LAB_001236f3:
        pcStack_4a0 = (code *)0x1236f8;
        allocInst();
        pBVar36 = pBVar30;
        pBVar55 = pBVar56;
LAB_001236f8:
        pcStack_4a0 = (code *)0x1236fd;
        allocInst();
        pBVar30 = pBVar31;
        pBVar43 = pBVar42;
        goto LAB_001236fd;
      }
      pBVar22 = pBVar42;
      pBVar56 = pBVar55;
      if ((((RAAssignment *)&pBVar34->field_0x48)->_layout).workCount <= uVar35) goto LAB_001236d0;
      bVar25 = ((RAAssignment *)&pBVar34->field_0x48)->_workToPhysMap[uVar35].physIds[0];
      bVar2 = *(undefined1 *)((long)&(pBVar42->super_FuncPass).super_Pass._cb + 6);
      pBVar30 = (BaseRAPass *)(ulong)bVar2;
      if (bVar2 == 0xff) {
        if (bVar25 != 0xff) {
          uVar49 = 1 << (bVar25 & 0x1f);
          pBVar48 = (BaseRAPass *)(ulong)uVar49;
          uVar35 = ~uStack_484 & *(uint *)&(pBVar42->super_FuncPass).super_Pass._name;
          pBVar30 = (BaseRAPass *)(ulong)uVar35;
          if ((uVar35 >> (bVar25 & 0x1f) & 1) != 0) {
            *(byte *)((long)&(pBVar42->super_FuncPass).super_Pass._cb + 6) = bVar25;
            *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb = uVar27 | 0x100;
            if ((uVar27 & 2) != 0) {
              puVar50 = (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap->dirty)._masks._data
                        + (long)pBVar57;
              *puVar50 = *puVar50 | uVar49;
            }
            goto LAB_00122687;
          }
LAB_00122699:
          pBStack_480 = (BaseRAPass *)(ulong)((uint)pBStack_480 | (uint)pBVar48);
        }
        goto LAB_001226a6;
      }
      uVar49 = 1 << (bVar2 & 0x1f);
      pBVar48 = (BaseRAPass *)(ulong)uVar49;
      if ((uStack_484 >> (bVar2 & 0x1f) & 1) != 0) {
        if (bVar25 != bVar2) {
          pBVar48 = (BaseRAPass *)
                    (ulong)(uVar49 & (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap->
                                     assigned)._masks._data[(long)pBVar57]);
          goto LAB_00122699;
        }
        *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb = uVar27 | 0x100;
        pBVar30 = (BaseRAPass *)(ulong)(uVar27 | 0x100);
        if ((uVar27 & 2) != 0) {
          uVar27 = 1 << (bVar25 & 0x1f);
          pBVar45 = (BaseRAPass *)(ulong)uVar27;
          puVar50 = (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap->dirty)._masks._data +
                    (long)pBVar57;
          *puVar50 = *puVar50 | uVar27;
          pBVar30 = (BaseRAPass *)(ulong)CONCAT31((int3)(uVar35 >> 8),bVar25);
        }
LAB_00122687:
        pBVar55 = (BaseRAPass *)(ulong)((int)pBVar55 - 1);
        uStack_484 = uStack_484 | (uint)pBVar48;
        goto LAB_001226a6;
      }
      goto LAB_0012370c;
    }
    pBVar45 = (BaseRAPass *)(ulong)(uVar27 | 0x100);
    *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb = uVar27 | 0x100;
    pBVar55 = (BaseRAPass *)(ulong)((int)pBVar55 - 1);
LAB_001226a6:
    pBVar42 = (BaseRAPass *)&pBVar42->field_0x20;
    pBVar40 = (BaseRAPass *)(&pBVar40[-1].field_0x3b0 + 0xff);
    uVar33 = uVar19;
  } while (pBVar40 != (BaseRAPass *)0x0);
  uStack_424 = (uint)uVar19;
  pBVar38 = pBStack_480;
  if (uVar26 != 0) {
    if ((uVar26 + 1 & uVar26) != 0) {
      return 3;
    }
    uVar27 = 0;
    if (~uVar26 != 0) {
      for (; (~uVar26 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
      }
    }
    pBStack_440 = (BaseRAPass *)(ulong)uVar27;
    if (((ulong)(((FuncPass *)auStack_3f8._16_8_)->super_Pass)._cb & 0x400) == 0) goto LAB_00122909;
    uVar26 = (((RARegMask *)&pBVar34->_allocator)->_masks)._data[(long)pBVar57];
    if (uVar27 != 0) {
      uVar35 = (((RAAssignment *)&pBVar34->field_0x48)->_layout).workCount;
      pBVar42 = (BaseRAPass *)(ulong)uVar35;
      pBVar22 = (BaseRAPass *)((RAAssignment *)&pBVar34->field_0x48)->_workToPhysMap;
      pBVar45 = (BaseRAPass *)0x0;
      while( true ) {
        pBVar48 = (BaseRAPass *)(ulong)*(uint *)alStack_3b8[(long)&pBVar45[-1].field_0x4aa];
        pBVar30 = pBVar36;
        pBVar56 = pBVar55;
        if (pBVar48 == (BaseRAPass *)0xffffffff) goto LAB_001236f3;
        if (uVar35 <= *(uint *)alStack_3b8[(long)&pBVar45[-1].field_0x4aa]) break;
        *(uint *)(auStack_3f8 + (long)pBVar45 * 4) =
             (uint)(byte)*(BaseNode *)
                          ((long)&pBVar22[1].super_FuncPass.super_Pass._vptr_Pass +
                          (long)(pBVar48 + -1));
        pBVar45 = (BaseRAPass *)((long)&(pBVar45->super_FuncPass).super_Pass._vptr_Pass + 1);
        if (pBStack_440 == pBVar45) goto LAB_0012273d;
      }
      goto LAB_001236f8;
    }
LAB_0012273d:
    uVar35 = *(uint *)&(pBVar31->super_FuncPass).super_Pass._name;
    if (uVar35 == 0) {
      return 0x3d;
    }
    pBVar22 = (BaseRAPass *)(pBVar34->super_FuncPass).super_Pass._vptr_Pass;
    pBVar45 = (BaseRAPass *)(ulong)(uVar27 * 4);
    pBVar30 = (BaseRAPass *)0xffffffff;
    pBVar48 = (BaseRAPass *)0x0;
    uVar49 = uVar35;
    do {
      uVar29 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
        }
      }
      pBStack_468 = pBStack_440;
      if ((uVar35 >> (uVar29 & 0x1f) & 1) != 0) {
        if (uVar27 == 0) {
          pBVar37 = (BaseRAPass *)0xf;
        }
        else {
          pBVar31 = (BaseRAPass *)(ulong)uVar29;
          pBVar37 = (BaseRAPass *)0xf;
          pBVar53 = (BaseRAPass *)0x0;
          do {
            if ((((uVar26 | (uint)pBStack_480) & ~uStack_484) >> ((uint)pBVar31 & 0x1f) & 1) == 0) {
              pBVar37 = (BaseRAPass *)0x0;
              break;
            }
            if (*(uint *)&pBVar22->field_0x148 <=
                **(uint **)(auStack_3f8 + (long)pBVar53 * 2 + 0x10)) {
              pcStack_4a0 = (code *)0x123696;
              allocInst();
              goto LAB_00123696;
            }
            bVar59 = pBVar31 ==
                     (BaseRAPass *)
                     (ulong)*(byte *)(*(long *)(*(long *)&pBVar22->_workRegs +
                                               (ulong)**(uint **)(auStack_3f8 +
                                                                 (long)pBVar53 * 2 + 0x10) * 8) +
                                     0x4a);
            pBVar36 = (BaseRAPass *)(ulong)bVar59;
            pBVar47 = (BaseRAPass *)(ulong)*(uint *)(auStack_3f8 + (long)pBVar53);
            pBVar37 = (BaseRAPass *)
                      (ulong)((int)pBVar37 + (uint)bVar59 + (uint)(pBVar31 == pBVar47) * 2);
            pBVar53 = (BaseRAPass *)((long)&(pBVar53->super_FuncPass).super_Pass._vptr_Pass + 4);
            pBVar31 = (BaseRAPass *)((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass + 1);
            pBVar34 = pBStack_498;
          } while (pBVar45 != pBVar53);
        }
        if ((uint)pBVar48 < (uint)pBVar37) {
          pBVar30 = (BaseRAPass *)(ulong)uVar29;
          pBVar48 = pBVar37;
        }
      }
      uVar49 = uVar49 - 1 & uVar49;
    } while (uVar49 != 0);
    if ((int)pBVar30 == -1) {
      return 0x3d;
    }
    pBVar31 = pBVar30;
    pBVar53 = pBVar34;
    if (uVar27 == 0) goto LAB_00122909;
    uVar33 = 0;
    while( true ) {
      uVar35 = 1 << ((byte)pBVar30 & 0x1f);
      pBVar40 = (BaseRAPass *)(ulong)uVar35;
      pBVar22 = *(BaseRAPass **)(auStack_3f8 + uVar33 + 0x10);
      uVar26 = *(uint *)&(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
      pBVar45 = (BaseRAPass *)(ulong)uVar26;
      pBVar48 = (BaseRAPass *)0xffffffff;
      if (pBVar45 == (BaseRAPass *)0xffffffff) goto LAB_00123711;
      if ((((RAAssignment *)&pBVar34->field_0x48)->_layout).workCount <= uVar26) break;
      pBVar48 = (BaseRAPass *)((RAAssignment *)&pBVar34->field_0x48)->_workToPhysMap;
      BVar3 = *(BaseNode *)
               ((long)&pBVar48[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar45 + -1));
      pBVar45 = (BaseRAPass *)(ulong)(byte)BVar3;
      *(byte *)((long)&(pBVar22->super_FuncPass).super_Pass._cb + 6) = (byte)pBVar30;
      if ((uint)pBVar30 == (uint)(byte)BVar3) {
        uVar26 = *(uint *)&(pBVar22->super_FuncPass).super_Pass._cb;
        pBVar45 = (BaseRAPass *)(ulong)uVar26;
        pBVar48 = (BaseRAPass *)(ulong)(uVar26 | 0x100);
        *(uint *)&(pBVar22->super_FuncPass).super_Pass._cb = uVar26 | 0x100;
        if ((uVar26 & 2) != 0) {
          puVar50 = (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap->dirty)._masks._data +
                    (long)pBVar57;
          *puVar50 = *puVar50 | uVar35;
        }
        pBVar55 = (BaseRAPass *)(ulong)((int)pBVar55 - 1);
      }
      else {
        pBVar38 = (BaseRAPass *)
                  (ulong)((uint)pBVar38 |
                         (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap->assigned)._masks.
                         _data[(long)pBVar57] & uVar35);
      }
      uStack_484 = uStack_484 | uVar35;
      uVar33 = uVar33 + 8;
      pBVar30 = (BaseRAPass *)(ulong)((uint)pBVar30 + 1);
      pBVar31 = pBVar30;
      if (uVar27 << 3 == uVar33) goto LAB_00122909;
    }
    goto LAB_00123716;
  }
  pBStack_440 = (BaseRAPass *)0x0;
  pBVar31 = pBVar30;
LAB_00122909:
  pBVar58 = pBVar57;
  pBVar40 = pBVar43;
  if ((int)pBVar55 == 0) {
    pBVar55 = (BaseRAPass *)0x0;
LAB_00122c6a:
    pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBVar55);
    if ((uint)pBVar38 != 0) {
      pBVar37 = (BaseRAPass *)
                (ulong)(~(uStack_484 | (uint)pBVar38 |
                         (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->assigned)._masks.
                         _data[(long)pBVar58] | uStack_454) &
                       (((RARegMask *)&pBVar53->_allocator)->_masks)._data[(long)pBVar58]);
      do {
        uVar46 = 0;
        if ((uint)pBVar38 != 0) {
          for (; ((uint)pBVar38 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
          }
        }
        pBVar36 = (BaseRAPass *)(ulong)uVar46;
        pPVar21 = ((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap;
        pBVar31 = pBVar36;
        if (((pPVar21->assigned)._masks._data[(long)pBVar58] >> (uVar46 & 0x1f) & 1) != 0) {
          puVar50 = (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkIds)._data[(long)pBVar58];
          uVar28 = puVar50[(long)pBVar36];
          uVar26 = (uint)pBVar37;
          pBVar47 = pBVar58;
          pBStack_480 = pBVar38;
          if (uVar26 != 0) {
            pBVar47 = (BaseRAPass *)((ulong)pBVar58 & 0xff);
            pcStack_4a0 = (code *)0x122ce8;
            pBVar45 = pBVar37;
            pBVar48 = pBStack_408;
            uVar17 = decideOnReassignment
                               ((RALocalAllocator *)pBVar53,(RegGroup)pBVar58,uVar28,
                                (uint32_t)puVar50,uVar26,(RAInst *)pBStack_408);
            if (uVar17 != 0xff) {
              if (uVar17 != uVar46) {
                pBVar45 = (BaseRAPass *)(ulong)uVar46;
                pcStack_4a0 = (code *)0x122d4d;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_460,(RegGroup)pBVar58,uVar28,uVar17,uVar46);
                pBVar34 = (BaseRAPass *)(pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_4a0 = (code *)0x122d62;
                EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar34,(ulong)uVar28,(ulong)uVar17,(ulong)uVar46);
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
              pBVar31 = (BaseRAPass *)(ulong)uVar17;
              pBVar37 = (BaseRAPass *)(ulong)(uVar26 ^ 1 << (uVar17 & 0x1f));
              puVar50 = (((RARegMask *)&pBStack_498->field_0x28)->_masks)._data + (long)pBStack_490;
              *puVar50 = *puVar50 | 1 << ((byte)uVar17 & 0x1f);
              pBVar40 = pBStack_470;
              pBVar38 = pBStack_480;
              pBVar53 = pBStack_498;
              pBVar58 = pBStack_490;
              goto LAB_00122d90;
            }
            pPVar21 = ((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap;
            pBVar47 = pBStack_490;
          }
          if (((pPVar21->dirty)._masks._data[(long)pBVar47] & 1 << ((byte)uVar46 & 0x1f)) != 0) {
            pcStack_4a0 = (code *)0x122d10;
            EVar14 = onSaveReg((RALocalAllocator *)pBVar53,(RegGroup)pBVar47,uVar28,uVar46);
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          pBVar31 = (BaseRAPass *)(ulong)uVar46;
          pcStack_4a0 = (code *)0x122d2b;
          RAAssignment::unassign((RAAssignment *)pBStack_460,(RegGroup)pBVar47,uVar28,uVar46);
          pBVar40 = pBStack_470;
          pBVar38 = pBStack_480;
          pBVar58 = pBVar47;
        }
LAB_00122d90:
        uVar46 = (uint)pBVar38 - 1 & (uint)pBVar38;
        pBVar38 = (BaseRAPass *)(ulong)uVar46;
      } while (uVar46 != 0);
    }
    pBVar22 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
    pBVar38 = (BaseRAPass *)(ulong)uStack_488;
    pBVar41 = pBVar40;
    if ((uint)pBStack_468 != 0) {
      pBStack_430 = (BaseRAPass *)(ulong)(uint)((int)pBStack_448 << 5);
      pBVar31 = (BaseRAPass *)(ulong)(uint)((int)uStack_410 << 5);
      pBStack_420 = (BaseRAPass *)
                    ((long)&(pBStack_420->super_FuncPass).super_Pass._vptr_Pass +
                    (long)&pBVar31->field_0x5a);
      pBStack_450 = (BaseRAPass *)((ulong)pBStack_450 & 0xffffffff00000000);
      pBVar30 = pBVar53;
      do {
        pBVar42 = pBVar22;
        pBVar53 = pBVar30;
        if ((int)pBVar38 != 0) {
          pBVar47 = (BaseRAPass *)0x0;
          pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBVar22);
          pBVar57 = pBVar58;
LAB_00122df5:
          pBVar58 = pBStack_490;
          pBVar53 = pBStack_498;
          if ((*(byte *)((long)&pBVar40->super_FuncPass + (long)pBVar47 * 0x20 + 9) & 1) != 0)
          goto LAB_001230c8;
          pBVar55 = (BaseRAPass *)((long)&pBVar40->super_FuncPass + (long)pBVar47 * 0x20);
          uVar46 = *(uint *)&(pBVar55->super_FuncPass).super_Pass._vptr_Pass;
          pBVar37 = (BaseRAPass *)(ulong)uVar46;
          if (pBVar37 != (BaseRAPass *)0xffffffff) {
            pBVar48 = pBVar22;
            if ((((RAAssignment *)&pBVar30->field_0x48)->_layout).workCount <= uVar46)
            goto LAB_001236b7;
            BVar3 = (BaseNode)
                    ((WorkToPhysMap *)
                    ((long)&(pBVar37->super_FuncPass).super_Pass._vptr_Pass +
                    (long)((RAAssignment *)&pBVar30->field_0x48)->_workToPhysMap))->physIds[0];
            pBVar36 = (BaseRAPass *)(ulong)(byte)BVar3;
            BVar4 = *(BaseNode *)((long)&(pBVar55->super_FuncPass).super_Pass._cb + 6);
            pBVar30 = (BaseRAPass *)(ulong)(byte)BVar4;
            if (BVar4 == BVar3) goto LAB_001236bc;
            pBVar34 = pBVar30;
            if (0x1f < (byte)BVar4) goto LAB_001236c1;
            uVar28 = *(uint *)(*(long *)(&pBStack_498->field_0x48 + (long)pBVar57 * 8 + 0x28) +
                              (long)pBVar30 * 4);
            pBVar57 = (BaseRAPass *)(ulong)uVar28;
            uVar27 = (uint)(byte)BVar4;
            uVar26 = (uint)(byte)BVar3;
            pBStack_480 = pBVar22;
            if (pBVar57 == (BaseRAPass *)0xffffffff) {
LAB_00122fc6:
              pBVar57 = pBStack_490;
              if (BVar3 == (BaseNode)0xff) {
                pBVar45 = (BaseRAPass *)0x0;
                pcStack_4a0 = (code *)0x12301a;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_460,(RegGroup)pBStack_490,uVar46,uVar27,false);
                pBVar34 = (BaseRAPass *)(pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_4a0 = (code *)0x12302c;
                EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                   (pBVar34,pBVar37,(ulong)uVar27);
              }
              else {
                pBVar45 = (BaseRAPass *)(ulong)uVar26;
                pcStack_4a0 = (code *)0x122fe9;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_460,(RegGroup)pBStack_490,uVar46,uVar27,uVar26);
                pBVar34 = (BaseRAPass *)(pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_4a0 = (code *)0x122ffd;
                EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar34,pBVar37,(ulong)uVar27,(ulong)uVar26);
              }
              if (EVar14 != 0) {
                return EVar14;
              }
              uVar46 = *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb;
              uVar28 = uVar46 | 0x100;
              pBVar31 = (BaseRAPass *)(ulong)uVar28;
              *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb = uVar28;
              if ((uVar46 & 2) != 0) {
                pBVar31 = (BaseRAPass *)((RAAssignment *)&pBStack_498->field_0x48)->_physToWorkMap;
                puVar50 = (uint *)((long)(&pBVar31->_formatOptions + -10) + (long)pBVar57 * 4);
                *puVar50 = *puVar50 | 1 << ((byte)BVar4 & 0x1f);
              }
              pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_480 - 1);
              pBVar40 = pBStack_470;
LAB_00123085:
              pBVar38 = (BaseRAPass *)(ulong)uStack_488;
              pBVar42 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
              pBVar30 = pBStack_498;
              goto LAB_001230c8;
            }
            pp_Var51 = (pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
            if (*(uint *)(pp_Var51 + 0x29) <= uVar28) goto LAB_001236c6;
            pBVar31 = pBVar30;
            if ((uVar26 != 0xff) &&
               (pcVar6 = (pBStack_498->super_FuncPass).super_Pass._name,
               bVar25 = *(byte *)((long)(&pBStack_490->_formatOptions + -10) + (long)pcVar6),
               pBVar31 = (BaseRAPass *)
                         (CONCAT71((int7)((ulong)pcVar6 >> 8),bVar25) & 0xffffffffffffff01),
               (bVar25 & 1) != 0)) {
              pp_Stack_438 = *(_func_int ***)(pp_Var51[0x28] + (long)pBVar57 * 8);
              pcStack_4a0 = (code *)0x122ec8;
              RAAssignment::swap((RAAssignment *)pBStack_460,(RegGroup)pBStack_490,uVar46,uVar26,
                                 uVar28,(uint)(byte)BVar4);
              pBVar34 = (BaseRAPass *)(pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_4a0 = (code *)0x122edf;
              EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[10])
                                 (pBVar34,pBVar37,(ulong)uVar26,pBVar57,(ulong)(uint)(byte)BVar4);
              if (EVar14 != 0) {
                return EVar14;
              }
              uVar46 = *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb;
              *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb = uVar46 | 0x100;
              if ((uVar46 & 2) != 0) {
                puVar50 = (((RAAssignment *)&pBStack_498->field_0x48)->_physToWorkMap->dirty)._masks
                          ._data + (long)pBStack_490;
                *puVar50 = *puVar50 | 1 << ((byte)BVar4 & 0x1f);
              }
              pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_480 - 1);
              pBVar31 = (BaseRAPass *)0x0;
              pBVar42 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
              do {
                pBVar30 = pBStack_498;
                pBVar40 = pBStack_470;
                pBVar45 = pBStack_430;
                if (*(int *)(&pBStack_420[-1].field_0x3b0 + 0xf2 + (long)pBVar31) ==
                    *(int *)pp_Stack_438) {
                  pBVar38 = (BaseRAPass *)(ulong)uStack_488;
                  pBVar57 = pBStack_490;
                  if (*(BaseNode *)
                       ((long)&pBStack_420[1].super_FuncPass.super_Pass._vptr_Pass +
                       (long)(pBVar31 + -1)) != BVar3) goto LAB_001230c8;
                  uVar46 = *(uint *)(&pBStack_420[-1].field_0x3b0 + 0xfa + (long)pBVar31);
                  *(uint *)(&pBStack_420[-1].field_0x3b0 + 0xfa + (long)pBVar31) = uVar46 | 0x100;
                  if ((uVar46 & 2) != 0) {
                    pBVar31 = (BaseRAPass *)
                              ((RAAssignment *)&pBStack_498->field_0x48)->_physToWorkMap;
                    puVar50 = (uint *)((long)(&pBVar31->_formatOptions + -10) +
                                      (long)pBStack_490 * 4);
                    *puVar50 = *puVar50 | 1 << ((byte)BVar3 & 0x1f);
                  }
                  pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_480 - 2);
                  break;
                }
                pBVar31 = (BaseRAPass *)&pBVar31->field_0x20;
              } while (pBStack_430 != pBVar31);
              pBVar38 = (BaseRAPass *)(ulong)uStack_488;
              pBVar57 = pBStack_490;
              goto LAB_001230c8;
            }
            pBVar57 = pBStack_490;
            if (((ulong)pBStack_450 & 1) == 0) goto LAB_00123085;
            uVar35 = ~*(uint *)(*(long *)(&pBStack_498->field_0x48 + 0x20) + (long)pBStack_490 * 4)
                     & *(uint *)(&pBStack_498->_allocator + (long)pBStack_490 * 4);
            if (uVar35 == 0) {
              if ((*(uint *)(*(long *)(&pBStack_498->field_0x48 + 0x20) + 0x10 +
                            (long)pBStack_490 * 4) >> (uVar27 & 0x1f) & 1) != 0) {
                pcStack_4a0 = (code *)0x122fa5;
                EVar14 = onSaveReg((RALocalAllocator *)pBStack_498,(RegGroup)pBStack_490,uVar28,
                                   uVar27);
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
              pcStack_4a0 = (code *)0x122fc6;
              RAAssignment::unassign
                        ((RAAssignment *)pBStack_460,(RegGroup)pBStack_490,uVar28,uVar27);
              goto LAB_00122fc6;
            }
            uVar28 = ~*(uint *)(&pBStack_498->field_0x38 + (long)pBStack_490 * 4) & uVar35;
            if (uVar28 == 0) {
              uVar28 = uVar35;
            }
            uVar27 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            if (uVar27 != uVar26) {
              pBVar45 = (BaseRAPass *)(ulong)uVar26;
              pcStack_4a0 = (code *)0x123123;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_460,(RegGroup)pBStack_490,uVar46,uVar27,uVar26);
              pp_Var51 = (pBVar53->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_4a0 = (code *)0x123134;
              EVar14 = (**(code **)(*pp_Var51 + 0x48))(pp_Var51,pBVar37,uVar27,BVar3);
              pBVar40 = pBStack_470;
              pBVar47 = pBVar58;
              if (EVar14 != 0) {
                return EVar14;
              }
            }
            pBVar31 = (BaseRAPass *)(ulong)uVar27;
            *(uint *)(&pBVar53->field_0x28 + (long)pBVar58 * 4) =
                 *(uint *)(&pBVar53->field_0x28 + (long)pBVar58 * 4) | 1 << ((byte)uVar27 & 0x1f);
            pBVar38 = (BaseRAPass *)(ulong)uStack_488;
            pBVar42 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
            goto LAB_001230d9;
          }
          pcStack_4a0 = (code *)0x1236b7;
          allocInst();
          pBVar48 = pBVar22;
LAB_001236b7:
          pcStack_4a0 = (code *)0x1236bc;
          allocInst();
LAB_001236bc:
          pcStack_4a0 = (code *)0x1236c1;
          allocInst();
          pBVar34 = pBVar30;
LAB_001236c1:
          pBVar30 = pBVar31;
          pcStack_4a0 = (code *)0x1236c6;
          allocInst();
LAB_001236c6:
          pcStack_4a0 = (code *)0x1236cb;
          allocInst();
          goto LAB_001236cb;
        }
LAB_001230d9:
        pBVar31 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar31 >> 8),(int)pBVar42 == (int)pBVar22);
        pBStack_450 = (BaseRAPass *)CONCAT44(pBStack_450._4_4_,(int)pBVar31);
        pBVar41 = pBVar40;
        pBVar30 = pBVar53;
      } while ((int)pBVar22 != 0);
    }
    cVar60 = uStack_474 == 0;
    pBVar36 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar36 >> 8),cVar60);
    if ((bool)cVar60) {
      pBStack_448 = (BaseRAPass *)0x0;
      uStack_474 = 0;
      pBVar56 = (BaseRAPass *)(ulong)uStack_454;
      pBVar57 = pBVar58;
      cVar60 = cStack_475;
    }
    else {
      pBStack_448 = (BaseRAPass *)(ulong)uStack_474;
      pBVar55 = (BaseRAPass *)0x0;
      pBVar56 = (BaseRAPass *)(ulong)uStack_454;
      do {
        pBVar47 = (BaseRAPass *)alStack_3b8[(long)pBVar55];
        uVar46 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass;
        pBVar38 = (BaseRAPass *)(ulong)uVar46;
        if (pBVar38 == (BaseRAPass *)0xffffffff) goto LAB_001236d5;
        if ((((RAAssignment *)&pBVar53->field_0x48)->_layout).workCount <= uVar46)
        goto LAB_001236da;
        bVar25 = ((WorkToPhysMap *)
                 ((long)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass +
                 (long)((RAAssignment *)&pBVar53->field_0x48)->_workToPhysMap))->physIds[0];
        pBVar37 = (BaseRAPass *)(ulong)bVar25;
        uVar28 = (uint)bVar25;
        if (uVar28 != 0xff) {
          pBVar41 = (BaseRAPass *)((ulong)pBStack_490 & 0xff);
          pBVar31 = (BaseRAPass *)(ulong)uVar28;
          pcStack_4a0 = (code *)0x1231cb;
          pBVar22 = pBStack_460;
          RAAssignment::unassign((RAAssignment *)pBStack_460,(RegGroup)pBStack_490,uVar46,uVar28);
          pBVar56 = (BaseRAPass *)(ulong)((uint)pBVar56 & ~(1 << (bVar25 & 0x1f)));
          pBVar38 = extraout_RDX_00;
        }
        uStack_474 = (uStack_474 - 1) +
                     (uint)((*(uint *)&(pBVar47->super_FuncPass).super_Pass._cb >> 3 & 1) != 0);
        pBVar55 = (BaseRAPass *)((long)&(pBVar55->super_FuncPass).super_Pass._vptr_Pass + 1);
        pBVar57 = pBStack_490;
      } while (pBStack_448 != pBVar55);
    }
    goto LAB_00123209;
  }
  if (uVar28 == 0) goto LAB_00122c6a;
  pBVar22 = (BaseRAPass *)
            (ulong)(~(uint)pBVar38 &
                   (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->assigned)._masks._data
                   [(long)pBVar57]);
  uVar46 = uVar46 << 5;
  pBVar47 = (BaseRAPass *)
            ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
            ((ulong)uVar46 - 0xc));
  pBVar45 = (BaseRAPass *)(ulong)(uVar28 << 5);
  pBVar36 = (BaseRAPass *)0x0;
  pBVar31 = pBVar41;
  pBStack_450 = pBVar45;
  while (uVar28 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                            ((ulong)uVar46 - 0x1c) + (long)pBVar36), (uVar28 >> 8 & 1) != 0) {
LAB_00122bd1:
    pBVar36 = (BaseRAPass *)&pBVar36->field_0x20;
    pBVar40 = pBVar43;
    pBVar58 = pBVar57;
    if (pBVar45 == pBVar36) goto LAB_00122c6a;
  }
  uVar26 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                     ((ulong)uVar46 - 0x24) + (long)pBVar36);
  pBVar37 = (BaseRAPass *)(ulong)uVar26;
  pBVar30 = (BaseRAPass *)0xffffffff;
  if (pBVar37 == (BaseRAPass *)0xffffffff) goto LAB_00123702;
  if ((((RAAssignment *)&pBVar53->field_0x48)->_layout).workCount <= uVar26) goto LAB_00123707;
  pBVar30 = (BaseRAPass *)((RAAssignment *)&pBVar53->field_0x48)->_workToPhysMap;
  BVar3 = *(BaseNode *)
           ((long)&pBVar30[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar37 + -1));
  pBVar53 = (BaseRAPass *)(ulong)(byte)BVar3;
  iVar15 = (int)pBVar55;
  if ((((uStack_400 & 1) != 0) || ((uVar28 & 0x10) == 0)) || (BVar3 != (BaseNode)0xff)) {
LAB_00122995:
    pBVar31 = pBVar30;
    pBVar53 = pBStack_498;
    pBVar57 = pBStack_490;
    if (*(BaseNode *)
         ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
          ((ulong)uVar46 - 0x16) + (long)pBVar36) == (BaseNode)0xff) {
      pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBVar22);
      pp_Stack_438 = (_func_int **)CONCAT44(pp_Stack_438._4_4_,(uint)(RegGroup)pBStack_490);
      pcStack_4a0 = (code *)0x122aeb;
      uVar17 = decideOnAssignment((RALocalAllocator *)pBStack_498,(RegGroup)pBStack_490,uVar26,
                                  (uint32_t)pBVar30,
                                  ~(uStack_484 | (uint)pBVar38) &
                                  *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->
                                                  _physToWorkIds)._data + ((ulong)uVar46 - 0x14) +
                                           (long)pBVar36));
      pBVar31 = (BaseRAPass *)(ulong)uVar17;
      uVar28 = 1 << ((byte)SUB41(uVar17,0) & 0x1f);
      pBVar48 = (BaseRAPass *)(ulong)uVar28;
      uVar27 = (uint)pBVar38 | uVar28 & (uint)pBStack_468;
      pBVar38 = (BaseRAPass *)(ulong)uVar27;
      *(BaseNode *)
       ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
        ((ulong)uVar46 - 0x16) + (long)pBVar36) = SUB41(uVar17,0);
      uVar35 = (uint)(byte)BVar3;
      pBVar53 = pBStack_498;
      if (uVar35 == 0xff) {
        uVar27 = (uint)pBStack_468;
        if ((uVar28 & (uint)pBStack_468) == 0) {
          pBStack_430 = (BaseRAPass *)CONCAT44(pBStack_430._4_4_,uVar28);
          pcStack_4a0 = (code *)0x122c03;
          pBStack_480 = pBVar38;
          RAAssignment::assign
                    ((RAAssignment *)pBStack_460,(RegGroup)pp_Stack_438,uVar26,uVar17,false);
          pBVar53 = pBStack_498;
          pBVar34 = (BaseRAPass *)(pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
          pcStack_4a0 = (code *)0x122c19;
          EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[0xb])(pBVar34,pBVar37,pBVar31);
          if (EVar14 != 0) {
            return EVar14;
          }
          uVar28 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar46 - 0x1c) + (long)pBVar36);
          *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                    ((ulong)uVar46 - 0x1c) + (long)pBVar36) = uVar28 | 0x100;
          pBVar48 = (BaseRAPass *)((ulong)pBStack_430 & 0xffffffff);
          if ((uVar28 & 2) != 0) {
            puVar50 = (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->dirty)._masks._data +
                      (long)pBStack_490;
            *puVar50 = *puVar50 | (uint)pBStack_430;
          }
          pBVar55 = (BaseRAPass *)(ulong)(iVar15 - 1);
          pBVar37 = pBVar31;
          pBVar38 = pBStack_480;
          uVar27 = (uint)pBStack_468;
        }
      }
      else {
        pBVar38 = (BaseRAPass *)(ulong)(uVar27 | 1 << (uVar35 & 0x1f));
        uVar27 = (uint)pBStack_468 & ~(1 << (uVar35 & 0x1f));
        if ((uVar28 & uVar27) == 0) {
          if (uVar17 != uVar35) {
            pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,uVar27);
            pBStack_430 = (BaseRAPass *)CONCAT44(pBStack_430._4_4_,uVar28);
            pcStack_4a0 = (code *)0x122b51;
            pBStack_480 = pBVar38;
            RAAssignment::reassign
                      ((RAAssignment *)pBStack_460,(RegGroup)pp_Stack_438,uVar26,uVar17,
                       (uint)(byte)BVar3);
            pBVar34 = (BaseRAPass *)(pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
            pcStack_4a0 = (code *)0x122b66;
            EVar14 = (*(pBVar34->super_FuncPass).super_Pass._vptr_Pass[9])
                               (pBVar34,pBVar37,pBVar31,(ulong)(byte)BVar3);
            pBVar48 = (BaseRAPass *)((ulong)pBStack_430 & 0xffffffff);
            pBVar38 = pBStack_480;
            uVar27 = (uint)pBStack_468;
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          uVar28 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar46 - 0x1c) + (long)pBVar36);
          *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                    ((ulong)uVar46 - 0x1c) + (long)pBVar36) = uVar28 | 0x100;
          if ((uVar28 & 2) != 0) {
            puVar50 = (((RAAssignment *)&pBStack_498->field_0x48)->_physToWorkMap->dirty)._masks.
                      _data + (long)pBStack_490;
            *puVar50 = *puVar50 | (uint)pBVar48;
          }
          pBVar55 = (BaseRAPass *)(ulong)(iVar15 - 1);
          pBVar53 = pBStack_498;
        }
      }
      uStack_484 = uStack_484 | 1 << (uVar17 & 0x1f);
      pBVar22 = (BaseRAPass *)(ulong)(uVar27 | (uint)pBVar48);
      pBVar43 = pBStack_470;
      pBVar45 = pBStack_450;
      pBVar57 = pBStack_490;
    }
    goto LAB_00122bd1;
  }
  uVar28 = *(uint *)((long)&pBVar47->_archTraits + (long)&pBVar36[-1].field_0x3b0);
  pBVar57 = (BaseRAPass *)(ulong)uVar28;
  uVar27 = uVar28 ^ uVar28 - 1;
  pBVar30 = (BaseRAPass *)(ulong)uVar27;
  if (uVar27 <= uVar28 - 1) goto LAB_00122995;
  pp_Var51 = (pBStack_498->super_FuncPass).super_Pass._vptr_Pass;
  if (uVar26 < *(uint *)(pp_Var51 + 0x29)) {
    pBVar30 = *(BaseRAPass **)(pp_Var51[0x28] + (long)pBVar37 * 8);
    BVar4 = *(BaseNode *)
             ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
              ((ulong)uVar46 - 0x17) + (long)pBVar36);
    pBVar48 = (BaseRAPass *)(ulong)(byte)BVar4;
    pBVar44 = (BaseCompiler *)(pBVar30->super_FuncPass).super_Pass._cb;
    uVar27._0_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._emitterType;
    uVar27._1_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._emitterFlags;
    uVar27._2_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._instructionAlignment;
    uVar27._3_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._reservedBaseEmitter;
    if ((byte)BVar4 <= uVar27) {
      if (*(long *)(((RARegMask *)&pBVar30->_allocator)->_masks)._data == 0) {
        pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBVar22);
        pcStack_4a0 = (code *)0x122a33;
        pBStack_480 = pBVar38;
        pp_Stack_438 = pp_Var51;
        pRVar20 = RAStackAllocator::newSlot
                            ((RAStackAllocator *)(pp_Var51 + 0x3f),
                             *(uint32_t *)((long)pp_Var51 + 0x1dc),uVar27,
                             (uint)(byte)(char)(pBVar44->super_BaseBuilder).super_BaseEmitter.
                                               _validationFlags,1);
        pBVar22 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
        *(RAStackSlot **)(((RARegMask *)&pBVar30->_allocator)->_masks)._data = pRVar20;
        pBVar30->field_0x25 = pBVar30->field_0x25 | 1;
        pBVar43 = pBStack_470;
        pBVar45 = pBStack_450;
        pBVar38 = pBStack_480;
        pp_Var51 = pp_Stack_438;
      }
      uVar26 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      pIVar39 = (InstNode *)(auStack_3f8._56_8_ + (ulong)(uVar26 & 0xfffffffc) * 4);
      uVar28 = *(uint *)(pp_Var51 + 0x3b);
      *(uint32_t *)(pIVar39 + 4) =
           *(uint32_t *)((long)&(pBVar30->super_FuncPass).super_Pass._vptr_Pass + 4);
      *(undefined8 *)(pIVar39 + 8) = 0;
      pBVar48 = (BaseRAPass *)((ulong)(byte)BVar4 << 0x18);
      uVar28 = (uVar28 & 0xf8) + (int)pBVar48 + 0x2002;
      pBVar31 = (BaseRAPass *)(ulong)uVar28;
      *(uint *)pIVar39 = uVar28;
      *(undefined4 *)((long)&pBVar47->_archTraits + (long)&pBVar36[-1].field_0x3b0) = 0;
      pBVar8 = (BaseNode *)
               ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                ((ulong)uVar46 - 0x1b) + (long)pBVar36);
      *pBVar8 = (BaseNode)((byte)*pBVar8 | 1);
      puVar11 = (undefined1 *)((long)&(pBStack_408->super_FuncPass).super_Pass._cb + 7);
      *puVar11 = *puVar11 | 0x40;
      pBVar55 = (BaseRAPass *)(ulong)(iVar15 - 1);
      uStack_400 = CONCAT71((int7)((ulong)pBStack_408 >> 8),1);
      pBVar37 = pBVar30;
      pBVar53 = pBStack_498;
      pBVar57 = pBStack_490;
      goto LAB_00122bd1;
    }
    goto LAB_00122995;
  }
LAB_00123720:
  pcStack_4a0 = (code *)0x123725;
  allocInst();
LAB_00123725:
  pcStack_4a0 = decideOnAssignment;
  allocInst();
  uVar46 = (uint)pBVar45;
  if (uVar46 == 0) {
    pBStack_4a8 = (BaseRAPass *)0x123782;
    decideOnAssignment();
LAB_00123782:
    pBStack_4a8 = (BaseRAPass *)0x123787;
    decideOnAssignment();
  }
  else {
    pBVar34 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar34->field_0x148 <= extraout_EDX) goto LAB_00123782;
    pBVar30 = *(BaseRAPass **)(*(long *)&pBVar34->_workRegs + (ulong)extraout_EDX * 8);
    bVar25 = (((RAAssignment *)&pBVar30->field_0x48)->_layout).physIndex.super_RARegCount.field_0.
             _regs[2];
    if ((bVar25 != 0xff) && ((uVar46 >> (bVar25 & 0x1f) & 1) != 0)) {
      return (uint)bVar25;
    }
    if ((byte)pBVar43 < 4) {
      uVar28 = (((RARegMask *)&pBVar30->field_0x38)->_masks)._data[1] & uVar46;
      if (uVar28 == 0) {
        uVar28 = uVar46;
      }
      uVar46 = ~(((RARegMask *)&pBVar22->field_0x38)->_masks)._data[(ulong)pBVar43 & 0xff] & uVar28;
      if (uVar46 == 0) {
        uVar46 = uVar28;
      }
      EVar14 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> EVar14 & 1) == 0; EVar14 = EVar14 + 1) {
        }
        return EVar14;
      }
      return 0;
    }
  }
  uVar46 = (uint)pBVar30;
  pBStack_4a8 = (BaseRAPass *)decideOnReassignment;
  decideOnAssignment();
  uVar28 = (uint)pBVar45;
  pBStack_4a8 = pBVar37;
  if (uVar28 == 0) {
    pBStack_4b0 = (BaseRAPass *)0x12385b;
    decideOnReassignment();
LAB_0012385b:
    pBStack_4b0 = (BaseRAPass *)0x123860;
    decideOnReassignment();
  }
  else {
    pBVar34 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar34->field_0x148 <= extraout_EDX_00) goto LAB_0012385b;
    lVar18 = *(long *)(*(long *)&pBVar34->_workRegs + (ulong)extraout_EDX_00 * 8);
    bVar25 = *(byte *)(lVar18 + 0x4a);
    if ((bVar25 != 0xff) && ((uVar28 >> (bVar25 & 0x1f) & 1) != 0)) {
      return (uint)bVar25;
    }
    uVar46 = extraout_EDX_00;
    if ((byte)pBVar43 < 4) {
      bVar25 = *(byte *)((long)(((RARegMask *)&pBVar48->_allocator)->_masks)._data +
                        ((ulong)pBVar43 & 0xff));
      if (bVar25 == 0) goto LAB_0012382f;
      uVar46 = *(uint *)((long)&(pBVar48->super_FuncPass).super_Pass._name + 4) >>
               ((byte)pBVar43 * '\b' & 0x1f) & 0xff;
      lVar52 = 0;
      goto LAB_00123806;
    }
  }
  pBStack_4b0 = (BaseRAPass *)0x123865;
  decideOnReassignment();
  pBStack_4d0 = pBVar37;
  pBStack_4c8 = pBVar47;
  pBStack_4c0 = pBVar55;
  pBStack_4b8 = pBVar57;
  pBStack_4b0 = pBVar36;
  if (uVar46 == 0) {
LAB_00123944:
    pBStack_4d8 = (BaseRAPass *)0x123949;
    decideOnSpillFor();
LAB_00123949:
    pBStack_4d8 = (BaseRAPass *)0x12394e;
    decideOnSpillFor();
  }
  else {
    if (3 < (byte)pBVar43) goto LAB_00123949;
    uVar28 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
      }
    }
    uVar33 = (ulong)pBVar43 & 0xff;
    pBVar43 = (BaseRAPass *)(((RAAssignment *)&pBVar22->field_0x48)->_physToWorkIds)._data[uVar33];
    uVar26 = (((RARegMask *)&pBVar43->_allocator)->_masks)._data[(ulong)uVar28 - 6];
    pBVar34 = (BaseRAPass *)(ulong)uVar26;
    uVar46 = uVar46 - 1 & uVar46;
    if (uVar46 == 0) {
LAB_00123933:
      *(uint *)&(pBVar45->super_FuncPass).super_Pass._vptr_Pass = uVar26;
      return uVar28;
    }
    pBVar48 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    uVar27 = *(uint *)&pBVar48->field_0x148;
    if (uVar26 < uVar27) {
      lVar18 = *(long *)&pBVar48->_workRegs;
      uVar49 = (uint)(*(float *)(*(long *)(lVar18 + (long)pBVar34 * 8) + 100) * 1048576.0);
      uVar35 = (((RAAssignment *)&pBVar22->field_0x48)->_physToWorkMap->dirty)._masks._data[uVar33];
      pBVar22 = (BaseRAPass *)(ulong)uVar35;
      uVar26 = uVar49 + 0x40000;
      if ((uVar35 >> (uVar28 & 0x1f) & 1) == 0) {
        uVar26 = uVar49;
      }
      pBVar48 = (BaseRAPass *)(ulong)uVar26;
      while( true ) {
        uVar49 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
          }
        }
        pBVar37 = (BaseRAPass *)(ulong)uVar49;
        uVar26 = (((RARegMask *)&pBVar43->_allocator)->_masks)._data
                 [(long)(&pBVar37[-1].field_0x3b0 + 0xfa)];
        pBVar55 = (BaseRAPass *)(ulong)uVar26;
        if (uVar27 <= uVar26) break;
        uVar26 = (uint)(*(float *)(*(long *)(lVar18 + (long)pBVar55 * 8) + 100) * 1048576.0);
        pBVar57 = (BaseRAPass *)(ulong)uVar26;
        pBVar47 = (BaseRAPass *)(ulong)(uVar26 + 0x40000);
        if ((uVar35 >> (uVar49 & 0x1f) & 1) == 0) {
          pBVar47 = pBVar57;
        }
        bVar59 = (uint)pBVar47 < (uint)pBVar48;
        if (bVar59) {
          pBVar34 = pBVar55;
          pBVar48 = pBVar47;
        }
        uVar26 = (uint)pBVar34;
        if (bVar59) {
          uVar28 = uVar49;
        }
        uVar46 = uVar46 - 1 & uVar46;
        pBVar36 = (BaseRAPass *)(ulong)uVar46;
        if (uVar46 == 0) goto LAB_00123933;
      }
      pBStack_4d8 = (BaseRAPass *)0x123944;
      decideOnSpillFor();
      goto LAB_00123944;
    }
  }
  pBStack_4d8 = (BaseRAPass *)0x123953;
  decideOnSpillFor();
  lVar18 = *(long *)&pBVar43->field_0x20;
  pIVar39 = (InstNode *)(ulong)*(uint *)(lVar18 + 0x10);
  if (pIVar39 == (InstNode *)0x0) {
    return 0;
  }
  pBStack_518 = (BaseRAPass *)&pBVar22->field_0x48;
  lVar52 = lVar18 + 0x54;
  pIVar54 = (InstNode *)0x0;
  pBVar34 = pBVar22;
  pIStack_510 = pIVar39;
  pBStack_508 = pBVar43;
  pBStack_500 = pBVar37;
  pBStack_4f8 = pBVar47;
  pBStack_4f0 = pBVar53;
  pBStack_4e8 = pBVar55;
  pBStack_4e0 = pBVar57;
  pBStack_4d8 = pBVar36;
  do {
    if ((InstNode *)(ulong)*(uint *)(lVar18 + 0x10) <= pIVar54) {
      pBStack_530 = (BaseRAPass *)0x123a70;
      spillAfterAllocation();
LAB_00123a70:
      pBStack_530 = (BaseRAPass *)0x123a75;
      spillAfterAllocation();
LAB_00123a75:
      pBStack_530 = (BaseRAPass *)0x123a7a;
      spillAfterAllocation();
LAB_00123a7a:
      pBStack_530 = (BaseRAPass *)0x123a7f;
      spillAfterAllocation();
LAB_00123a7f:
      pBStack_530 = (BaseRAPass *)allocBranch;
      spillAfterAllocation();
      (((BaseCompiler *)(pBVar34->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
           *(BaseNode **)pIVar39;
      lStack_558 = lVar52;
      pBStack_550 = pBVar47;
      pIStack_548 = pIVar54;
      pBStack_540 = pBVar22;
      lStack_538 = lVar18;
      pBStack_530 = pBVar36;
      if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
         (EVar14 = switchToAssignment((RALocalAllocator *)pBVar34,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true), EVar14 != 0)
         ) {
        return EVar14;
      }
      EVar14 = allocInst((RALocalAllocator *)pBVar34,pIVar39);
      if (EVar14 != 0) {
        return EVar14;
      }
      uVar46 = *(uint *)(block + 0xb8);
      if ((ulong)uVar46 == 0xffffffff) {
        pRVar23 = block + 0xbc;
LAB_00123b18:
        EVar14 = spillScratchGpRegsBeforeEntry((RALocalAllocator *)pBVar34,*(RegMask *)pRVar23);
        if (EVar14 != 0) {
          return EVar14;
        }
        pBVar36 = (BaseRAPass *)(pBVar34->super_FuncPass).super_Pass._vptr_Pass;
        if (*(long *)(block + 200) == 0) {
          EVar14 = BaseRAPass::setBlockEntryAssignment
                             (pBVar36,block,*(RABlock **)&pBVar34->field_0xd8,
                              (RAAssignment *)&pBVar34->field_0x48);
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        else {
          pBVar8 = *(BaseNode **)pBVar36->_extraBlock;
          pBVar24 = BaseBuilder::setCursor
                              ((BaseBuilder *)(pBVar34->super_FuncPass).super_Pass._cb,pBVar8);
          __src = ((RAAssignment *)&pBVar34->field_0x48)->_workToPhysMap;
          memcpy(*(PhysToWorkMap **)&(pBVar34->_blocks).field_0x0,
                 ((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap,
                 (ulong)*(uint *)&pBVar34->_func * 4 + 0x20);
          memcpy(pBVar34->_extraBlock,__src,(ulong)*(uint32_t *)((long)&pBVar34->_func + 4));
          EVar14 = switchToAssignment((RALocalAllocator *)pBVar34,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar14 != 0) {
            return EVar14;
          }
          pBVar44 = (BaseCompiler *)(pBVar34->super_FuncPass).super_Pass._cb;
          if ((pBVar44->super_BaseBuilder)._cursor != pBVar8) {
            if ((uint)(byte)pIVar39[0x13] <= (byte)pIVar39[0x12] - 1) goto LAB_00123cba;
            lVar18 = (ulong)((byte)pIVar39[0x12] - 1) * 0x10;
            if ((*(uint *)(pIVar39 + lVar18 + 0x40) & 7) != 5) goto LAB_00123cbf;
            (*(pBVar44->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_580);
            uStack_570 = *(undefined8 *)(pIVar39 + lVar18 + 0x40);
            uStack_568 = *(undefined8 *)(pIVar39 + lVar18 + 0x48);
            *(undefined4 *)(pIVar39 + lVar18 + 0x40) = uStack_580;
            *(undefined4 *)(pIVar39 + lVar18 + 0x44) = uStack_57c;
            *(undefined4 *)(pIVar39 + lVar18 + 0x48) = uStack_578;
            *(undefined4 *)(pIVar39 + lVar18 + 0x4c) = uStack_574;
            pIVar39[0x34] = (InstNode)((byte)pIVar39[0x34] & 0xef);
            EVar14 = (*(((BaseRAPass *)(pBVar34->super_FuncPass).super_Pass._vptr_Pass)->
                       super_FuncPass).super_Pass._vptr_Pass[0xd])();
            if (EVar14 != 0) {
              return EVar14;
            }
            pBVar44 = (BaseCompiler *)(pBVar34->super_FuncPass).super_Pass._cb;
            (pBVar44->super_BaseBuilder)._cursor = pBVar8;
            (*(pBVar44->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                      (pBVar44,&uStack_580);
            pBVar44 = (BaseCompiler *)(pBVar34->super_FuncPass).super_Pass._cb;
          }
          (pBVar44->super_BaseBuilder)._cursor = pBVar24;
          pBVar8 = (BaseNode *)((RAAssignment *)&pBVar34->field_0x48)->_workToPhysMap;
          pPVar21 = ((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap;
          pPVar9 = *(PhysToWorkMap **)&(pBVar34->_blocks).field_0x0;
          ((RAAssignment *)&pBVar34->field_0x48)->_workToPhysMap =
               (WorkToPhysMap *)pBVar34->_extraBlock;
          ((RAAssignment *)&pBVar34->field_0x48)->_physToWorkMap = pPVar9;
          pBVar34->_extraBlock = pBVar8;
          *(PhysToWorkMap **)&(pBVar34->_blocks).field_0x0 = pPVar21;
          lVar18 = 0;
          do {
            ppuVar1 = (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkIds)._data + lVar18;
            puVar50 = *ppuVar1;
            puVar32 = ppuVar1[1];
            puVar10 = (uint *)((undefined8 *)((long)(&pBVar34->_formatOptions + 4) + lVar18 * 8))[1]
            ;
            ppuVar1 = (((RAAssignment *)&pBVar34->field_0x48)->_physToWorkIds)._data + lVar18;
            *ppuVar1 = *(uint **)((long)(&pBVar34->_formatOptions + 4) + lVar18 * 8);
            ppuVar1[1] = puVar10;
            *(undefined8 *)((long)(&pBVar34->_formatOptions + 4) + lVar18 * 8) = puVar50;
            ((undefined8 *)((long)(&pBVar34->_formatOptions + 4) + lVar18 * 8))[1] = puVar32;
            lVar18 = lVar18 + 2;
          } while (lVar18 != 4);
        }
        EVar14 = 0;
      }
      else {
        if (uVar46 < *(uint *)(*(long *)block + 0xf0)) {
          pRVar23 = (RABlock *)((ulong)uVar46 * 0x20 + *(long *)(*(long *)block + 0xe8));
          goto LAB_00123b18;
        }
        allocBranch();
LAB_00123cba:
        allocBranch();
LAB_00123cbf:
        EVar14 = 3;
      }
      return EVar14;
    }
    if ((*(byte *)(lVar52 + 2) & 2) != 0) {
      uVar46 = *(uint *)(lVar52 + -8);
      pBVar47 = (BaseRAPass *)(ulong)uVar46;
      pBVar45 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
      if (*(uint *)&pBVar45->field_0x148 <= uVar46) goto LAB_00123a70;
      lVar7 = *(long *)(*(long *)&pBVar45->_workRegs + (long)pBVar47 * 8);
      if (*(char *)(lVar7 + 0x4a) != -1) goto LAB_00123a4a;
      if ((((RAAssignment *)&pBVar22->field_0x48)->_layout).workCount <= uVar46) goto LAB_00123a75;
      bVar25 = ((RAAssignment *)&pBVar22->field_0x48)->_workToPhysMap[(long)pBVar47].physIds[0];
      pBVar36 = (BaseRAPass *)(ulong)bVar25;
      if (bVar25 == 0xff) goto LAB_00123a4a;
      RVar13 = *(RegGroup *)(lVar7 + 0x21);
      (((BaseCompiler *)(pBVar22->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
           (BaseNode *)pBStack_508;
      if (0x1f < bVar25) goto LAB_00123a7a;
      RVar13 = RVar13 & kMaxValue;
      if (RVar13 < kPC) {
        if (((((RAAssignment *)&pBVar22->field_0x48)->_physToWorkMap->dirty)._masks._data[RVar13] >>
             (bVar25 & 0x1f) & 1) != 0) {
          pBStack_530 = (BaseRAPass *)0x123a2d;
          uStack_520 = (ulong)RVar13;
          EVar14 = onSaveReg((RALocalAllocator *)pBVar22,RVar13,uVar46,(uint)bVar25);
          RVar13 = (RegGroup)uStack_520;
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        pBStack_530 = (BaseRAPass *)0x123a45;
        pBVar34 = pBStack_518;
        RAAssignment::unassign((RAAssignment *)pBStack_518,RVar13,uVar46,(uint)bVar25);
        pIVar39 = pIStack_510;
        goto LAB_00123a4a;
      }
      goto LAB_00123a7f;
    }
LAB_00123a4a:
    pIVar54 = pIVar54 + 1;
    lVar52 = lVar52 + 0x20;
    if (pIVar39 == pIVar54) {
      return 0;
    }
  } while( true );
LAB_001230c8:
  pBVar58 = pBVar57;
  pBVar47 = (BaseRAPass *)((long)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass + 1);
  pBVar48 = pBVar22;
  pBVar53 = pBVar30;
  pBVar57 = pBVar58;
  if (pBVar47 == pBStack_448) goto LAB_001230d9;
  goto LAB_00122df5;
  while (lVar52 = lVar52 + 0x20, (ulong)bVar25 * 0x20 != lVar52) {
LAB_00123806:
    if (*(uint *)((long)(((RAAssignment *)&pBVar48->field_0x48)->_physToWorkIds)._data +
                 lVar52 + (ulong)(uVar46 << 5) + -0x24) == extraout_EDX_00) {
      if ((*(uint *)((long)(((RAAssignment *)&pBVar48->field_0x48)->_physToWorkIds)._data +
                    lVar52 + (ulong)(uVar46 << 5) + -0x1c) & 0x40008) != 0) {
        EVar14 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> EVar14 & 1) == 0; EVar14 = EVar14 + 1) {
          }
          return EVar14;
        }
        return 0;
      }
      break;
    }
  }
LAB_0012382f:
  if ((*(byte *)(lVar18 + 0x24) & 4) != 0) {
    return 0xff;
  }
  uVar28 = ~*(uint *)(lVar18 + 0x38) & uVar28;
  if (uVar28 != 0) {
    uVar46 = ~(((RARegMask *)&pBVar22->field_0x38)->_masks)._data[(ulong)pBVar43 & 0xff] & uVar28;
    if (uVar46 == 0) {
      uVar46 = uVar28;
    }
    EVar14 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> EVar14 & 1) == 0; EVar14 = EVar14 + 1) {
      }
      return EVar14;
    }
    return 0;
  }
  return 0xff;
}

Assistant:

Error RALocalAllocator::makeInitialAssignment() noexcept {
  FuncNode* func = _pass->func();
  RABlock* entry = _pass->entryBlock();

  ZoneBitVector& liveIn = entry->liveIn();
  uint32_t argCount = func->argCount();
  uint32_t numIter = 1;

  for (uint32_t iter = 0; iter < numIter; iter++) {
    for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
      for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
        // Unassigned argument.
        const RegOnly& regArg = func->argPack(argIndex)[valueIndex];
        if (!regArg.isReg() || !_cc->isVirtIdValid(regArg.id()))
          continue;

        VirtReg* virtReg = _cc->virtRegById(regArg.id());

        // Unreferenced argument.
        RAWorkReg* workReg = virtReg->workReg();
        if (!workReg)
          continue;

        // Overwritten argument.
        uint32_t workId = workReg->workId();
        if (!liveIn.bitAt(workId))
          continue;

        RegGroup group = workReg->group();
        if (_curAssignment.workToPhysId(group, workId) != RAAssignment::kPhysNone)
          continue;

        RegMask allocableRegs = _availableRegs[group] & ~_curAssignment.assigned(group);
        if (iter == 0) {
          // First iteration: Try to allocate to home RegId.
          if (workReg->hasHomeRegId()) {
            uint32_t physId = workReg->homeRegId();
            if (Support::bitTest(allocableRegs, physId)) {
              _curAssignment.assign(group, workId, physId, true);
              _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
              continue;
            }
          }

          numIter = 2;
        }
        else {
          // Second iteration: Pick any other register if the is an unassigned one or assign to stack.
          if (allocableRegs) {
            uint32_t physId = Support::ctz(allocableRegs);
            _curAssignment.assign(group, workId, physId, true);
            _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
          }
          else {
            // This register will definitely need stack, create the slot now and assign also `argIndex`
            // to it. We will patch `_argsAssignment` later after RAStackAllocator finishes.
            RAStackSlot* slot = _pass->getOrCreateStackSlot(workReg);
            if (ASMJIT_UNLIKELY(!slot))
              return DebugUtils::errored(kErrorOutOfMemory);

            // This means STACK_ARG may be moved to STACK.
            workReg->addFlags(RAWorkRegFlags::kStackArgToStack);
            _pass->_numStackArgsToStackSlots++;
          }
        }
      }
    }
  }

  return kErrorOk;
}